

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx2.cpp
# Opt level: O3

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Mat *hidden_state,Mat *cell_state,Option *opt)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  uint uVar6;
  uint _w;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  uint uVar23;
  int *piVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  void *pvVar33;
  int iVar34;
  uint uVar35;
  ulong uVar36;
  void *pvVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  void *pvVar41;
  void *pvVar42;
  void *pvVar43;
  _func_int ***ppp_Var44;
  void *pvVar45;
  void *pvVar46;
  void *pvVar47;
  void *pvVar48;
  ulong uVar49;
  ulong uVar50;
  void *pvVar51;
  void *pvVar52;
  int iVar53;
  long lVar54;
  int iVar55;
  void *pvVar56;
  uint uVar57;
  long lVar58;
  void *pvVar59;
  Allocator *pAVar60;
  void *pvVar61;
  void *pvVar62;
  long lVar63;
  void *pvVar64;
  void *pvVar65;
  ulong uVar66;
  void *pvVar67;
  void *pvVar68;
  long lVar69;
  void *pvVar70;
  void *pvVar71;
  ulong uVar72;
  uint uVar73;
  long lVar74;
  void *pvVar75;
  long lVar76;
  void *pvVar77;
  float fVar78;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar85 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar122 [64];
  undefined1 auVar124 [16];
  float fVar123;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar128 [64];
  float fVar133;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 in_ZMM5 [64];
  undefined1 auVar137 [64];
  undefined1 auVar144 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [64];
  undefined1 auVar148 [16];
  undefined1 in_ZMM9 [64];
  float fVar150;
  undefined1 auVar149 [32];
  undefined1 in_ZMM10 [64];
  float *bias_c_I;
  float *gates_data_G;
  float *gates_data_O;
  float *gates_data_F;
  float *bias_c_F;
  float *bias_c_G;
  float *bias_c_O;
  float *gates_data_I;
  void *local_2f0;
  void *local_2e0;
  void *local_2d8;
  void *local_2d0;
  void *local_2b0;
  void *local_290;
  void *local_270;
  void *local_268;
  void *local_260;
  void *local_258;
  void *local_250;
  void *local_188;
  void *local_180;
  void *local_178;
  void *local_170;
  void *local_168;
  Mat local_78;
  undefined1 auVar110 [32];
  undefined1 auVar116 [32];
  undefined1 auVar119 [32];
  undefined1 auVar127 [32];
  
  uVar73 = bottom_blob->w;
  uVar6 = bottom_blob->h;
  _w = top_blob->w;
  uVar49 = (ulong)_w;
  local_78.cstep = 0;
  local_78.data = (Allocator *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)local_78.data;
  local_78.dims = (int)local_78.refcount;
  local_78.w = local_78.refcount._4_4_;
  local_78._48_8_ = local_78.elemsize;
  local_78.c = local_78.elempack;
  Mat::create(&local_78,_w,4,4,(Allocator *)opt);
  iVar26 = -100;
  if (((Allocator *)local_78.data != (Allocator *)0x0) && ((long)local_78.c * local_78.cstep != 0))
  {
    if (0 < (int)uVar6) {
      uVar72 = (ulong)(int)_w;
      uVar36 = uVar72 & 0xfffffffffffffffe;
      uVar23 = _w * 2;
      uVar40 = (ulong)uVar23;
      uVar10 = _w * 3;
      uVar50 = (ulong)uVar10;
      iVar53 = (int)uVar73 >> 3;
      uVar73 = uVar73 & 7;
      iVar55 = (int)_w >> 3;
      uVar57 = _w & 7;
      uVar25 = iVar55 + 1;
      iVar26 = uVar57 + 1;
      lVar1 = (long)(int)uVar10 + uVar36;
      lVar2 = (long)(int)uVar23 + uVar36;
      uVar28 = 0;
      do {
        uVar35 = ~uVar28 + uVar6;
        if (reverse == 0) {
          uVar35 = uVar28;
        }
        local_2e0 = hidden_state->data;
        lVar29 = (long)local_78.w;
        if (1 < (int)_w) {
          pvVar45 = (void *)((long)(int)uVar35 * (long)bottom_blob->w * bottom_blob->elemsize +
                            (long)bottom_blob->data);
          pvVar46 = bias_c->data;
          lVar30 = (long)bias_c->w * bias_c->elemsize;
          lVar31 = local_78.elemsize * lVar29;
          lVar63 = (long)weight_xc->w * weight_xc->elemsize;
          pvVar52 = weight_xc->data;
          lVar74 = (long)weight_hc->w * weight_hc->elemsize;
          local_250 = (void *)(lVar63 * uVar49 + (long)pvVar52);
          pvVar47 = (void *)(lVar63 * uVar40 + (long)pvVar52);
          pvVar67 = (void *)(lVar63 * uVar50 + (long)pvVar52);
          pvVar56 = (void *)(lVar63 * (uVar49 + 1) + (long)pvVar52);
          pvVar51 = (void *)(lVar63 * (uVar40 + 1) + (long)pvVar52);
          pvVar37 = (void *)(lVar63 * (uVar50 + 1) + (long)pvVar52);
          pvVar71 = weight_hc->data;
          local_258 = (void *)(lVar74 * uVar49 + (long)pvVar71);
          local_260 = (void *)(lVar74 * uVar40 + (long)pvVar71);
          local_290 = (void *)(lVar74 * uVar50 + (long)pvVar71);
          local_268 = (void *)(lVar74 * (uVar49 + 1) + (long)pvVar71);
          pvVar68 = (void *)(lVar74 * (uVar40 + 1) + (long)pvVar71);
          pvVar61 = (void *)(lVar74 * (uVar50 + 1) + (long)pvVar71);
          lVar54 = lVar63 * 2;
          local_270 = (void *)((long)pvVar52 + lVar63);
          lVar32 = lVar74 * 2;
          pvVar75 = (void *)(lVar74 + (long)pvVar71);
          uVar39 = 0;
          pvVar42 = pvVar71;
          local_168 = pvVar52;
          do {
            uVar66 = uVar39 | 1;
            lVar58 = uVar49 + uVar39 + 1;
            lVar38 = uVar40 + uVar39 + 1;
            lVar69 = uVar39 + uVar50 + 1;
            if (iVar53 < 1) {
              local_170 = (void *)(lVar63 * uVar39 + (long)pvVar52);
              local_178 = (void *)(lVar63 * (uVar39 + uVar49) + (long)pvVar52);
              local_180 = (void *)(lVar63 * (uVar39 + uVar40) + (long)pvVar52);
              pvVar33 = (void *)(lVar63 * (uVar39 + uVar50) + (long)pvVar52);
              pvVar43 = (void *)(lVar63 * uVar66 + (long)pvVar52);
              pvVar41 = (void *)(lVar63 * lVar58 + (long)pvVar52);
              pvVar59 = (void *)(lVar63 * lVar38 + (long)pvVar52);
              pvVar77 = (void *)(lVar63 * lVar69 + (long)pvVar52);
              auVar85 = ZEXT864(0);
              auVar100 = ZEXT864(0);
              auVar122 = ZEXT864(0);
              auVar128 = ZEXT864(0);
              auVar137 = ZEXT864(0);
              in_ZMM6 = ZEXT864(0);
              auVar147 = ZEXT864(0);
              auVar111 = ZEXT864(0);
              pvVar48 = pvVar45;
            }
            else {
              auVar111 = ZEXT864(0);
              lVar76 = 0;
              auVar147 = ZEXT864(0);
              in_ZMM6 = ZEXT864(0);
              auVar137 = ZEXT864(0);
              auVar128 = ZEXT864(0);
              auVar122 = ZEXT864(0);
              auVar100 = ZEXT864(0);
              auVar85 = ZEXT864(0);
              uVar27 = iVar53 + 1U;
              do {
                pfVar3 = (float *)((long)pvVar45 + lVar76);
                fVar123 = *pfVar3;
                fVar133 = pfVar3[1];
                fVar129 = pfVar3[2];
                fVar138 = pfVar3[3];
                fVar130 = pfVar3[4];
                fVar139 = pfVar3[5];
                fVar131 = pfVar3[6];
                pfVar4 = (float *)((long)local_168 + lVar76);
                fVar132 = in_ZMM9._28_4_;
                auVar85 = ZEXT3264(CONCAT428(fVar132 + auVar85._28_4_,
                                             CONCAT424(fVar131 * pfVar4[6] + auVar85._24_4_,
                                                       CONCAT420(fVar139 * pfVar4[5] +
                                                                 auVar85._20_4_,
                                                                 CONCAT416(fVar130 * pfVar4[4] +
                                                                           auVar85._16_4_,
                                                                           CONCAT412(fVar138 * 
                                                  pfVar4[3] + auVar85._12_4_,
                                                  CONCAT48(fVar129 * pfVar4[2] + auVar85._8_4_,
                                                           CONCAT44(fVar133 * pfVar4[1] +
                                                                    auVar85._4_4_,
                                                                    fVar123 * *pfVar4 +
                                                                    auVar85._0_4_))))))));
                pfVar4 = (float *)((long)local_250 + lVar76);
                pfVar5 = (float *)((long)pvVar47 + lVar76);
                auVar100 = ZEXT3264(CONCAT428(fVar132 + auVar100._28_4_,
                                              CONCAT424(fVar131 * pfVar4[6] + auVar100._24_4_,
                                                        CONCAT420(fVar139 * pfVar4[5] +
                                                                  auVar100._20_4_,
                                                                  CONCAT416(fVar130 * pfVar4[4] +
                                                                            auVar100._16_4_,
                                                                            CONCAT412(fVar138 * 
                                                  pfVar4[3] + auVar100._12_4_,
                                                  CONCAT48(fVar129 * pfVar4[2] + auVar100._8_4_,
                                                           CONCAT44(fVar133 * pfVar4[1] +
                                                                    auVar100._4_4_,
                                                                    fVar123 * *pfVar4 +
                                                                    auVar100._0_4_))))))));
                fVar150 = in_ZMM10._28_4_;
                auVar122 = ZEXT3264(CONCAT428(fVar150 + auVar122._28_4_,
                                              CONCAT424(fVar131 * pfVar5[6] + auVar122._24_4_,
                                                        CONCAT420(fVar139 * pfVar5[5] +
                                                                  auVar122._20_4_,
                                                                  CONCAT416(fVar130 * pfVar5[4] +
                                                                            auVar122._16_4_,
                                                                            CONCAT412(fVar138 * 
                                                  pfVar5[3] + auVar122._12_4_,
                                                  CONCAT48(fVar129 * pfVar5[2] + auVar122._8_4_,
                                                           CONCAT44(fVar133 * pfVar5[1] +
                                                                    auVar122._4_4_,
                                                                    fVar123 * *pfVar5 +
                                                                    auVar122._0_4_))))))));
                pfVar4 = (float *)((long)pvVar67 + lVar76);
                auVar128 = ZEXT3264(CONCAT428(fVar132 + auVar128._28_4_,
                                              CONCAT424(fVar131 * pfVar4[6] + auVar128._24_4_,
                                                        CONCAT420(fVar139 * pfVar4[5] +
                                                                  auVar128._20_4_,
                                                                  CONCAT416(fVar130 * pfVar4[4] +
                                                                            auVar128._16_4_,
                                                                            CONCAT412(fVar138 * 
                                                  pfVar4[3] + auVar128._12_4_,
                                                  CONCAT48(fVar129 * pfVar4[2] + auVar128._8_4_,
                                                           CONCAT44(fVar133 * pfVar4[1] +
                                                                    auVar128._4_4_,
                                                                    fVar123 * *pfVar4 +
                                                                    auVar128._0_4_))))))));
                pfVar4 = (float *)((long)local_270 + lVar76);
                auVar137 = ZEXT3264(CONCAT428(fVar132 + auVar137._28_4_,
                                              CONCAT424(fVar131 * pfVar4[6] + auVar137._24_4_,
                                                        CONCAT420(fVar139 * pfVar4[5] +
                                                                  auVar137._20_4_,
                                                                  CONCAT416(fVar130 * pfVar4[4] +
                                                                            auVar137._16_4_,
                                                                            CONCAT412(fVar138 * 
                                                  pfVar4[3] + auVar137._12_4_,
                                                  CONCAT48(fVar129 * pfVar4[2] + auVar137._8_4_,
                                                           CONCAT44(fVar133 * pfVar4[1] +
                                                                    auVar137._4_4_,
                                                                    fVar123 * *pfVar4 +
                                                                    auVar137._0_4_))))))));
                pfVar4 = (float *)((long)pvVar56 + lVar76);
                in_ZMM9 = ZEXT3264(CONCAT428(fVar132,CONCAT424(fVar131 * pfVar4[6],
                                                               CONCAT420(fVar139 * pfVar4[5],
                                                                         CONCAT416(fVar130 * pfVar4[
                                                  4],CONCAT412(fVar138 * pfVar4[3],
                                                               CONCAT48(fVar129 * pfVar4[2],
                                                                        CONCAT44(fVar133 * pfVar4[1]
                                                                                 ,fVar123 * *pfVar4)
                                                                       )))))));
                pfVar5 = (float *)((long)pvVar51 + lVar76);
                in_ZMM10 = ZEXT3264(CONCAT428(fVar150,CONCAT424(fVar131 * pfVar5[6],
                                                                CONCAT420(fVar139 * pfVar5[5],
                                                                          CONCAT416(fVar130 * pfVar5
                                                  [4],CONCAT412(fVar138 * pfVar5[3],
                                                                CONCAT48(fVar129 * pfVar5[2],
                                                                         CONCAT44(fVar133 * pfVar5[1
                                                  ],fVar123 * *pfVar5))))))));
                in_ZMM6 = ZEXT3264(CONCAT428(fVar132 + in_ZMM6._28_4_,
                                             CONCAT424(fVar131 * pfVar4[6] + in_ZMM6._24_4_,
                                                       CONCAT420(fVar139 * pfVar4[5] +
                                                                 in_ZMM6._20_4_,
                                                                 CONCAT416(fVar130 * pfVar4[4] +
                                                                           in_ZMM6._16_4_,
                                                                           CONCAT412(fVar138 * 
                                                  pfVar4[3] + in_ZMM6._12_4_,
                                                  CONCAT48(fVar129 * pfVar4[2] + in_ZMM6._8_4_,
                                                           CONCAT44(fVar133 * pfVar4[1] +
                                                                    in_ZMM6._4_4_,
                                                                    fVar123 * *pfVar4 +
                                                                    in_ZMM6._0_4_))))))));
                auVar147 = ZEXT3264(CONCAT428(fVar150 + auVar147._28_4_,
                                              CONCAT424(fVar131 * pfVar5[6] + auVar147._24_4_,
                                                        CONCAT420(fVar139 * pfVar5[5] +
                                                                  auVar147._20_4_,
                                                                  CONCAT416(fVar130 * pfVar5[4] +
                                                                            auVar147._16_4_,
                                                                            CONCAT412(fVar138 * 
                                                  pfVar5[3] + auVar147._12_4_,
                                                  CONCAT48(fVar129 * pfVar5[2] + auVar147._8_4_,
                                                           CONCAT44(fVar133 * pfVar5[1] +
                                                                    auVar147._4_4_,
                                                                    fVar123 * *pfVar5 +
                                                                    auVar147._0_4_))))))));
                pfVar4 = (float *)((long)pvVar37 + lVar76);
                auVar111 = ZEXT3264(CONCAT428(pfVar3[7] + auVar111._28_4_,
                                              CONCAT424(fVar131 * pfVar4[6] + auVar111._24_4_,
                                                        CONCAT420(fVar139 * pfVar4[5] +
                                                                  auVar111._20_4_,
                                                                  CONCAT416(fVar130 * pfVar4[4] +
                                                                            auVar111._16_4_,
                                                                            CONCAT412(fVar138 * 
                                                  pfVar4[3] + auVar111._12_4_,
                                                  CONCAT48(fVar129 * pfVar4[2] + auVar111._8_4_,
                                                           CONCAT44(fVar133 * pfVar4[1] +
                                                                    auVar111._4_4_,
                                                                    fVar123 * *pfVar4 +
                                                                    auVar111._0_4_))))))));
                lVar76 = lVar76 + 0x20;
                uVar27 = uVar27 - 1;
              } while (1 < uVar27);
              local_170 = (void *)((long)local_168 + lVar76);
              local_178 = (void *)((long)local_250 + lVar76);
              local_180 = (void *)((long)pvVar47 + lVar76);
              pvVar33 = (void *)((long)pvVar67 + lVar76);
              pvVar43 = (void *)((long)local_270 + lVar76);
              pvVar41 = (void *)((long)pvVar56 + lVar76);
              pvVar59 = (void *)((long)pvVar51 + lVar76);
              pvVar77 = (void *)(lVar76 + (long)pvVar37);
              pvVar48 = (void *)((long)pvVar45 + lVar76);
            }
            auVar125 = auVar128._0_32_;
            auVar146 = auVar147._0_32_;
            auVar93 = auVar100._0_32_;
            auVar79 = auVar85._0_32_;
            auVar114 = auVar122._0_32_;
            auVar134 = auVar137._0_32_;
            auVar103 = auVar111._0_32_;
            if (iVar55 < 1) {
              local_188 = (void *)(lVar74 * uVar39 + (long)pvVar71);
              local_2f0 = (void *)((uVar39 + uVar49) * lVar74 + (long)pvVar71);
              pvVar64 = (void *)((uVar39 + uVar40) * lVar74 + (long)pvVar71);
              local_2d0 = (void *)((uVar39 + uVar50) * lVar74 + (long)pvVar71);
              pvVar65 = (void *)(lVar74 * uVar66 + (long)pvVar71);
              local_2b0 = (void *)(lVar58 * lVar74 + (long)pvVar71);
              local_2d8 = (void *)(lVar38 * lVar74 + (long)pvVar71);
              pvVar70 = (void *)(lVar69 * lVar74 + (long)pvVar71);
              pvVar62 = local_2e0;
            }
            else {
              lVar38 = 0;
              uVar27 = uVar25;
              do {
                pfVar3 = (float *)((long)local_2e0 + lVar38);
                fVar123 = *pfVar3;
                fVar133 = pfVar3[1];
                fVar129 = pfVar3[2];
                fVar138 = pfVar3[3];
                fVar130 = pfVar3[4];
                fVar139 = pfVar3[5];
                fVar131 = pfVar3[6];
                pfVar4 = (float *)((long)pvVar42 + lVar38);
                auVar79._0_4_ = fVar123 * *pfVar4 + auVar85._0_4_;
                auVar79._4_4_ = fVar133 * pfVar4[1] + auVar85._4_4_;
                auVar79._8_4_ = fVar129 * pfVar4[2] + auVar85._8_4_;
                auVar79._12_4_ = fVar138 * pfVar4[3] + auVar85._12_4_;
                auVar79._16_4_ = fVar130 * pfVar4[4] + auVar85._16_4_;
                auVar79._20_4_ = fVar139 * pfVar4[5] + auVar85._20_4_;
                auVar79._24_4_ = fVar131 * pfVar4[6] + auVar85._24_4_;
                fVar132 = in_ZMM9._28_4_;
                auVar79._28_4_ = fVar132 + auVar85._28_4_;
                auVar85 = ZEXT3264(auVar79);
                pfVar4 = (float *)((long)local_258 + lVar38);
                pfVar5 = (float *)((long)local_260 + lVar38);
                auVar93._0_4_ = fVar123 * *pfVar4 + auVar100._0_4_;
                auVar93._4_4_ = fVar133 * pfVar4[1] + auVar100._4_4_;
                auVar93._8_4_ = fVar129 * pfVar4[2] + auVar100._8_4_;
                auVar93._12_4_ = fVar138 * pfVar4[3] + auVar100._12_4_;
                auVar93._16_4_ = fVar130 * pfVar4[4] + auVar100._16_4_;
                auVar93._20_4_ = fVar139 * pfVar4[5] + auVar100._20_4_;
                auVar93._24_4_ = fVar131 * pfVar4[6] + auVar100._24_4_;
                auVar93._28_4_ = fVar132 + auVar100._28_4_;
                auVar100 = ZEXT3264(auVar93);
                auVar114._0_4_ = fVar123 * *pfVar5 + auVar122._0_4_;
                auVar114._4_4_ = fVar133 * pfVar5[1] + auVar122._4_4_;
                auVar114._8_4_ = fVar129 * pfVar5[2] + auVar122._8_4_;
                auVar114._12_4_ = fVar138 * pfVar5[3] + auVar122._12_4_;
                auVar114._16_4_ = fVar130 * pfVar5[4] + auVar122._16_4_;
                auVar114._20_4_ = fVar139 * pfVar5[5] + auVar122._20_4_;
                auVar114._24_4_ = fVar131 * pfVar5[6] + auVar122._24_4_;
                fVar150 = in_ZMM10._28_4_;
                auVar114._28_4_ = fVar150 + auVar122._28_4_;
                auVar122 = ZEXT3264(auVar114);
                pfVar4 = (float *)((long)local_290 + lVar38);
                auVar125._0_4_ = fVar123 * *pfVar4 + auVar128._0_4_;
                auVar125._4_4_ = fVar133 * pfVar4[1] + auVar128._4_4_;
                auVar125._8_4_ = fVar129 * pfVar4[2] + auVar128._8_4_;
                auVar125._12_4_ = fVar138 * pfVar4[3] + auVar128._12_4_;
                auVar125._16_4_ = fVar130 * pfVar4[4] + auVar128._16_4_;
                auVar125._20_4_ = fVar139 * pfVar4[5] + auVar128._20_4_;
                auVar125._24_4_ = fVar131 * pfVar4[6] + auVar128._24_4_;
                auVar125._28_4_ = fVar132 + auVar128._28_4_;
                auVar128 = ZEXT3264(auVar125);
                pfVar4 = (float *)((long)pvVar75 + lVar38);
                auVar134._0_4_ = fVar123 * *pfVar4 + auVar137._0_4_;
                auVar134._4_4_ = fVar133 * pfVar4[1] + auVar137._4_4_;
                auVar134._8_4_ = fVar129 * pfVar4[2] + auVar137._8_4_;
                auVar134._12_4_ = fVar138 * pfVar4[3] + auVar137._12_4_;
                auVar134._16_4_ = fVar130 * pfVar4[4] + auVar137._16_4_;
                auVar134._20_4_ = fVar139 * pfVar4[5] + auVar137._20_4_;
                auVar134._24_4_ = fVar131 * pfVar4[6] + auVar137._24_4_;
                auVar134._28_4_ = fVar132 + auVar137._28_4_;
                auVar137 = ZEXT3264(auVar134);
                pfVar4 = (float *)((long)local_268 + lVar38);
                in_ZMM9 = ZEXT3264(CONCAT428(fVar132,CONCAT424(fVar131 * pfVar4[6],
                                                               CONCAT420(fVar139 * pfVar4[5],
                                                                         CONCAT416(fVar130 * pfVar4[
                                                  4],CONCAT412(fVar138 * pfVar4[3],
                                                               CONCAT48(fVar129 * pfVar4[2],
                                                                        CONCAT44(fVar133 * pfVar4[1]
                                                                                 ,fVar123 * *pfVar4)
                                                                       )))))));
                pfVar5 = (float *)((long)pvVar68 + lVar38);
                in_ZMM10 = ZEXT3264(CONCAT428(fVar150,CONCAT424(fVar131 * pfVar5[6],
                                                                CONCAT420(fVar139 * pfVar5[5],
                                                                          CONCAT416(fVar130 * pfVar5
                                                  [4],CONCAT412(fVar138 * pfVar5[3],
                                                                CONCAT48(fVar129 * pfVar5[2],
                                                                         CONCAT44(fVar133 * pfVar5[1
                                                  ],fVar123 * *pfVar5))))))));
                in_ZMM6 = ZEXT3264(CONCAT428(fVar132 + in_ZMM6._28_4_,
                                             CONCAT424(fVar131 * pfVar4[6] + in_ZMM6._24_4_,
                                                       CONCAT420(fVar139 * pfVar4[5] +
                                                                 in_ZMM6._20_4_,
                                                                 CONCAT416(fVar130 * pfVar4[4] +
                                                                           in_ZMM6._16_4_,
                                                                           CONCAT412(fVar138 * 
                                                  pfVar4[3] + in_ZMM6._12_4_,
                                                  CONCAT48(fVar129 * pfVar4[2] + in_ZMM6._8_4_,
                                                           CONCAT44(fVar133 * pfVar4[1] +
                                                                    in_ZMM6._4_4_,
                                                                    fVar123 * *pfVar4 +
                                                                    in_ZMM6._0_4_))))))));
                auVar146._0_4_ = fVar123 * *pfVar5 + auVar147._0_4_;
                auVar146._4_4_ = fVar133 * pfVar5[1] + auVar147._4_4_;
                auVar146._8_4_ = fVar129 * pfVar5[2] + auVar147._8_4_;
                auVar146._12_4_ = fVar138 * pfVar5[3] + auVar147._12_4_;
                auVar146._16_4_ = fVar130 * pfVar5[4] + auVar147._16_4_;
                auVar146._20_4_ = fVar139 * pfVar5[5] + auVar147._20_4_;
                auVar146._24_4_ = fVar131 * pfVar5[6] + auVar147._24_4_;
                auVar146._28_4_ = fVar150 + auVar147._28_4_;
                auVar147 = ZEXT3264(auVar146);
                pfVar4 = (float *)((long)pvVar61 + lVar38);
                auVar103._0_4_ = fVar123 * *pfVar4 + auVar111._0_4_;
                auVar103._4_4_ = fVar133 * pfVar4[1] + auVar111._4_4_;
                auVar103._8_4_ = fVar129 * pfVar4[2] + auVar111._8_4_;
                auVar103._12_4_ = fVar138 * pfVar4[3] + auVar111._12_4_;
                auVar103._16_4_ = fVar130 * pfVar4[4] + auVar111._16_4_;
                auVar103._20_4_ = fVar139 * pfVar4[5] + auVar111._20_4_;
                auVar103._24_4_ = fVar131 * pfVar4[6] + auVar111._24_4_;
                auVar103._28_4_ = pfVar3[7] + auVar111._28_4_;
                auVar111 = ZEXT3264(auVar103);
                lVar38 = lVar38 + 0x20;
                uVar27 = uVar27 - 1;
              } while (1 < uVar27);
              local_188 = (void *)((long)pvVar42 + lVar38);
              local_2f0 = (void *)((long)local_258 + lVar38);
              pvVar64 = (void *)((long)local_260 + lVar38);
              local_2d0 = (void *)((long)local_290 + lVar38);
              pvVar65 = (void *)((long)pvVar75 + lVar38);
              local_2b0 = (void *)((long)local_268 + lVar38);
              local_2d8 = (void *)((long)pvVar68 + lVar38);
              pvVar70 = (void *)(lVar38 + (long)pvVar61);
              pvVar62 = (void *)((long)local_2e0 + lVar38);
            }
            auVar103 = vhaddps_avx(auVar146,auVar103);
            auVar134 = vhaddps_avx(auVar134,in_ZMM6._0_32_);
            in_ZMM5 = ZEXT3264(auVar134);
            auVar103 = vhaddps_avx(auVar134,auVar103);
            auVar114 = vhaddps_avx(auVar114,auVar125);
            auVar79 = vhaddps_avx(auVar79,auVar93);
            auVar93 = vhaddps_avx(auVar79,auVar114);
            auVar79 = vblendps_avx(auVar93,auVar103,0xf0);
            auVar92 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar46 + uVar66 * 4)),
                                    ZEXT416(*(uint *)((long)pvVar46 + uVar66 * 4 + lVar30)),0x10);
            auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)((long)pvVar46 +
                                                             uVar66 * 4 + lVar30 * 2)),0x20);
            auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)((long)pvVar46 +
                                                             uVar66 * 4 + lVar30 * 3)),0x30);
            in_ZMM3 = ZEXT1664(auVar92);
            auVar93 = vperm2f128_avx(auVar93,auVar103,0x21);
            auVar148 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar46 + uVar39 * 4)),
                                     ZEXT416(*(uint *)((long)pvVar46 + uVar39 * 4 + lVar30)),0x10);
            auVar148 = vinsertps_avx(auVar148,ZEXT416(*(uint *)((long)pvVar46 +
                                                               uVar39 * 4 + lVar30 * 2)),0x20);
            auVar148 = vinsertps_avx(auVar148,ZEXT416(*(uint *)((long)pvVar46 +
                                                               uVar39 * 4 + lVar30 * 3)),0x30);
            auVar85 = ZEXT3264(CONCAT428(auVar79._28_4_ + auVar93._28_4_ + auVar92._12_4_,
                                         CONCAT424(auVar79._24_4_ + auVar93._24_4_ + auVar92._8_4_,
                                                   CONCAT420(auVar79._20_4_ + auVar93._20_4_ +
                                                             auVar92._4_4_,
                                                             CONCAT416(auVar79._16_4_ +
                                                                       auVar93._16_4_ +
                                                                       auVar92._0_4_,
                                                                       CONCAT412(auVar79._12_4_ +
                                                                                 auVar93._12_4_ +
                                                                                 auVar148._12_4_,
                                                                                 CONCAT48(auVar79.
                                                  _8_4_ + auVar93._8_4_ + auVar148._8_4_,
                                                  CONCAT44(auVar79._4_4_ + auVar93._4_4_ +
                                                           auVar148._4_4_,
                                                           auVar79._0_4_ + auVar93._0_4_ +
                                                           auVar148._0_4_))))))));
            if (uVar73 != 0) {
              lVar38 = 0;
              iVar34 = uVar73 + 1;
              do {
                auVar92 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar43 + lVar38)),
                                        ZEXT416(*(uint *)((long)pvVar41 + lVar38)),0x10);
                auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)((long)pvVar59 + lVar38)),0x20);
                auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)((long)pvVar77 + lVar38)),0x30);
                auVar148 = vinsertps_avx(ZEXT416(*(uint *)((long)local_170 + lVar38)),
                                         ZEXT416(*(uint *)((long)local_178 + lVar38)),0x10);
                auVar148 = vinsertps_avx(auVar148,ZEXT416(*(uint *)((long)local_180 + lVar38)),0x20)
                ;
                auVar148 = vinsertps_avx(auVar148,ZEXT416(*(uint *)((long)pvVar33 + lVar38)),0x30);
                fVar123 = *(float *)((long)pvVar48 + lVar38);
                auVar85 = ZEXT3264(CONCAT428(auVar92._12_4_ + auVar85._28_4_,
                                             CONCAT424(auVar92._8_4_ * fVar123 + auVar85._24_4_,
                                                       CONCAT420(auVar92._4_4_ * fVar123 +
                                                                 auVar85._20_4_,
                                                                 CONCAT416(auVar92._0_4_ * fVar123 +
                                                                           auVar85._16_4_,
                                                                           CONCAT412(auVar148._12_4_
                                                                                     * fVar123 +
                                                                                     auVar85._12_4_,
                                                                                     CONCAT48(
                                                  auVar148._8_4_ * fVar123 + auVar85._8_4_,
                                                  CONCAT44(auVar148._4_4_ * fVar123 + auVar85._4_4_,
                                                           auVar148._0_4_ * fVar123 + auVar85._0_4_)
                                                  )))))));
                lVar38 = lVar38 + 4;
                iVar34 = iVar34 + -1;
              } while (1 < iVar34);
            }
            auVar80 = auVar85._0_32_;
            if (uVar57 != 0) {
              lVar38 = 0;
              iVar34 = iVar26;
              do {
                auVar92 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar65 + lVar38)),
                                        ZEXT416(*(uint *)((long)local_2b0 + lVar38)),0x10);
                auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)((long)local_2d8 + lVar38)),0x20);
                auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)((long)pvVar70 + lVar38)),0x30);
                auVar148 = vinsertps_avx(ZEXT416(*(uint *)((long)local_188 + lVar38)),
                                         ZEXT416(*(uint *)((long)local_2f0 + lVar38)),0x10);
                auVar148 = vinsertps_avx(auVar148,ZEXT416(*(uint *)((long)pvVar64 + lVar38)),0x20);
                auVar148 = vinsertps_avx(auVar148,ZEXT416(*(uint *)((long)local_2d0 + lVar38)),0x30)
                ;
                fVar123 = *(float *)((long)pvVar62 + lVar38);
                auVar80._0_4_ = auVar148._0_4_ * fVar123 + auVar85._0_4_;
                auVar80._4_4_ = auVar148._4_4_ * fVar123 + auVar85._4_4_;
                auVar80._8_4_ = auVar148._8_4_ * fVar123 + auVar85._8_4_;
                auVar80._12_4_ = auVar148._12_4_ * fVar123 + auVar85._12_4_;
                auVar80._16_4_ = auVar92._0_4_ * fVar123 + auVar85._16_4_;
                auVar80._20_4_ = auVar92._4_4_ * fVar123 + auVar85._20_4_;
                auVar80._24_4_ = auVar92._8_4_ * fVar123 + auVar85._24_4_;
                auVar80._28_4_ = auVar92._12_4_ + auVar85._28_4_;
                auVar85 = ZEXT3264(auVar80);
                lVar38 = lVar38 + 4;
                iVar34 = iVar34 + -1;
              } while (1 < iVar34);
            }
            *(int *)((long)(_func_int ***)local_78.data + uVar39 * 4) = auVar80._0_4_;
            auVar92 = auVar80._0_16_;
            uVar7 = vextractps_avx(auVar92,1);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar39 * 4 + lVar31) = uVar7;
            uVar7 = vextractps_avx(auVar92,2);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar39 * 4 + lVar31 * 2) = uVar7;
            uVar7 = vextractps_avx(auVar92,3);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar39 * 4 + lVar31 * 3) = uVar7;
            auVar92 = auVar80._16_16_;
            *(int *)((long)(_func_int ***)local_78.data + uVar66 * 4) = auVar80._16_4_;
            uVar7 = vextractps_avx(auVar92,1);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar66 * 4 + lVar31) = uVar7;
            uVar7 = vextractps_avx(auVar92,2);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar66 * 4 + lVar31 * 2) = uVar7;
            uVar7 = vextractps_avx(auVar92,3);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar66 * 4 + lVar31 * 3) = uVar7;
            lVar38 = uVar39 + 3;
            local_168 = (void *)((long)local_168 + lVar54);
            local_250 = (void *)((long)local_250 + lVar54);
            pvVar47 = (void *)((long)pvVar47 + lVar54);
            pvVar67 = (void *)((long)pvVar67 + lVar54);
            local_270 = (void *)((long)local_270 + lVar54);
            pvVar56 = (void *)((long)pvVar56 + lVar54);
            pvVar51 = (void *)((long)pvVar51 + lVar54);
            pvVar37 = (void *)((long)pvVar37 + lVar54);
            pvVar42 = (void *)((long)pvVar42 + lVar32);
            local_258 = (void *)((long)local_258 + lVar32);
            local_260 = (void *)((long)local_260 + lVar32);
            local_290 = (void *)((long)local_290 + lVar32);
            pvVar75 = (void *)((long)pvVar75 + lVar32);
            local_268 = (void *)((long)local_268 + lVar32);
            pvVar68 = (void *)((long)pvVar68 + lVar32);
            pvVar61 = (void *)((long)pvVar61 + lVar32);
            uVar39 = uVar39 + 2;
          } while (lVar38 < (long)uVar72);
        }
        auVar145._8_4_ = 0x3f800000;
        auVar145._0_8_ = 0x3f8000003f800000;
        auVar145._12_4_ = 0x3f800000;
        auVar145._16_4_ = 0x3f800000;
        auVar145._20_4_ = 0x3f800000;
        auVar145._24_4_ = 0x3f800000;
        auVar145._28_4_ = 0x3f800000;
        if ((uint)uVar36 == _w) {
          lVar54 = local_78.elemsize * lVar29 * 3;
        }
        else {
          pvVar45 = (void *)((long)bottom_blob->w * (long)(int)uVar35 * bottom_blob->elemsize +
                            (long)bottom_blob->data);
          lVar32 = (long)bias_c->w * bias_c->elemsize;
          pvVar46 = bias_c->data;
          lVar31 = local_78.elemsize * lVar29;
          pvVar52 = weight_xc->data;
          lVar30 = (long)weight_xc->w * weight_xc->elemsize;
          pvVar71 = weight_hc->data;
          lVar63 = (long)weight_hc->w * weight_hc->elemsize;
          pvVar61 = (void *)(lVar30 * lVar1 + (long)pvVar52);
          pvVar37 = (void *)(lVar30 * lVar2 + (long)pvVar52);
          pvVar56 = (void *)(lVar30 * (uVar72 + uVar36) + (long)pvVar52);
          pvVar42 = (void *)(lVar30 * uVar36 + (long)pvVar52);
          local_2d0 = (void *)(lVar63 * lVar1 + (long)pvVar71);
          pvVar47 = (void *)(lVar63 * lVar2 + (long)pvVar71);
          pvVar51 = (void *)(lVar63 * (uVar72 + uVar36) + (long)pvVar71);
          pvVar67 = (void *)(lVar63 * uVar36 + (long)pvVar71);
          lVar54 = lVar31 * 3;
          uVar39 = uVar36;
          do {
            lVar74 = uVar39 + (long)(int)uVar23;
            lVar38 = uVar39 + (long)(int)uVar10;
            if (iVar53 < 1) {
              pvVar43 = (void *)(lVar30 * uVar39 + (long)pvVar52);
              pvVar33 = (void *)(lVar30 * (uVar39 + uVar72) + (long)pvVar52);
              pvVar75 = (void *)(lVar30 * lVar74 + (long)pvVar52);
              pvVar68 = (void *)(lVar30 * lVar38 + (long)pvVar52);
              auVar100 = ZEXT864(0);
              auVar111 = ZEXT864(0);
              in_ZMM3 = ZEXT864(0);
              auVar85 = ZEXT864(0);
              pvVar41 = pvVar45;
            }
            else {
              auVar85 = ZEXT864(0);
              lVar58 = 0;
              in_ZMM3 = ZEXT864(0);
              auVar111 = ZEXT864(0);
              auVar100 = ZEXT864(0);
              auVar122 = in_ZMM6;
              uVar27 = iVar53 + 1U;
              do {
                pfVar3 = (float *)((long)pvVar45 + lVar58);
                fVar123 = *pfVar3;
                fVar133 = pfVar3[1];
                fVar129 = pfVar3[2];
                fVar138 = pfVar3[3];
                fVar130 = pfVar3[4];
                fVar139 = pfVar3[5];
                fVar131 = pfVar3[6];
                pfVar4 = (float *)((long)pvVar42 + lVar58);
                fVar132 = in_ZMM5._28_4_;
                auVar100 = ZEXT3264(CONCAT428(fVar132 + auVar100._28_4_,
                                              CONCAT424(fVar131 * pfVar4[6] + auVar100._24_4_,
                                                        CONCAT420(fVar139 * pfVar4[5] +
                                                                  auVar100._20_4_,
                                                                  CONCAT416(fVar130 * pfVar4[4] +
                                                                            auVar100._16_4_,
                                                                            CONCAT412(fVar138 * 
                                                  pfVar4[3] + auVar100._12_4_,
                                                  CONCAT48(fVar129 * pfVar4[2] + auVar100._8_4_,
                                                           CONCAT44(fVar133 * pfVar4[1] +
                                                                    auVar100._4_4_,
                                                                    fVar123 * *pfVar4 +
                                                                    auVar100._0_4_))))))));
                pfVar4 = (float *)((long)pvVar56 + lVar58);
                in_ZMM5 = ZEXT3264(CONCAT428(fVar132,CONCAT424(fVar131 * pfVar4[6],
                                                               CONCAT420(fVar139 * pfVar4[5],
                                                                         CONCAT416(fVar130 * pfVar4[
                                                  4],CONCAT412(fVar138 * pfVar4[3],
                                                               CONCAT48(fVar129 * pfVar4[2],
                                                                        CONCAT44(fVar133 * pfVar4[1]
                                                                                 ,fVar123 * *pfVar4)
                                                                       )))))));
                pfVar5 = (float *)((long)pvVar37 + lVar58);
                auVar128._0_4_ = fVar123 * *pfVar5;
                auVar128._4_4_ = fVar133 * pfVar5[1];
                auVar128._8_4_ = fVar129 * pfVar5[2];
                auVar128._12_4_ = fVar138 * pfVar5[3];
                auVar128._16_4_ = fVar130 * pfVar5[4];
                auVar128._20_4_ = fVar139 * pfVar5[5];
                auVar128._28_36_ = auVar122._28_36_;
                auVar128._24_4_ = fVar131 * pfVar5[6];
                in_ZMM6 = ZEXT3264(auVar128._0_32_);
                auVar111 = ZEXT3264(CONCAT428(fVar132 + auVar111._28_4_,
                                              CONCAT424(fVar131 * pfVar4[6] + auVar111._24_4_,
                                                        CONCAT420(fVar139 * pfVar4[5] +
                                                                  auVar111._20_4_,
                                                                  CONCAT416(fVar130 * pfVar4[4] +
                                                                            auVar111._16_4_,
                                                                            CONCAT412(fVar138 * 
                                                  pfVar4[3] + auVar111._12_4_,
                                                  CONCAT48(fVar129 * pfVar4[2] + auVar111._8_4_,
                                                           CONCAT44(fVar133 * pfVar4[1] +
                                                                    auVar111._4_4_,
                                                                    fVar123 * *pfVar4 +
                                                                    auVar111._0_4_))))))));
                in_ZMM3 = ZEXT3264(CONCAT428(auVar122._28_4_ + in_ZMM3._28_4_,
                                             CONCAT424(auVar128._24_4_ + in_ZMM3._24_4_,
                                                       CONCAT420(auVar128._20_4_ + in_ZMM3._20_4_,
                                                                 CONCAT416(auVar128._16_4_ +
                                                                           in_ZMM3._16_4_,
                                                                           CONCAT412(auVar128._12_4_
                                                                                     + in_ZMM3.
                                                  _12_4_,CONCAT48(auVar128._8_4_ + in_ZMM3._8_4_,
                                                                  CONCAT44(auVar128._4_4_ +
                                                                           in_ZMM3._4_4_,
                                                                           auVar128._0_4_ +
                                                                           in_ZMM3._0_4_))))))));
                pfVar4 = (float *)((long)pvVar61 + lVar58);
                auVar85 = ZEXT3264(CONCAT428(pfVar3[7] + auVar85._28_4_,
                                             CONCAT424(fVar131 * pfVar4[6] + auVar85._24_4_,
                                                       CONCAT420(fVar139 * pfVar4[5] +
                                                                 auVar85._20_4_,
                                                                 CONCAT416(fVar130 * pfVar4[4] +
                                                                           auVar85._16_4_,
                                                                           CONCAT412(fVar138 * 
                                                  pfVar4[3] + auVar85._12_4_,
                                                  CONCAT48(fVar129 * pfVar4[2] + auVar85._8_4_,
                                                           CONCAT44(fVar133 * pfVar4[1] +
                                                                    auVar85._4_4_,
                                                                    fVar123 * *pfVar4 +
                                                                    auVar85._0_4_))))))));
                uVar27 = uVar27 - 1;
                lVar58 = lVar58 + 0x20;
                auVar122 = in_ZMM6;
              } while (1 < uVar27);
              pvVar68 = (void *)(lVar58 + (long)pvVar61);
              pvVar75 = (void *)((long)pvVar37 + lVar58);
              pvVar33 = (void *)((long)pvVar56 + lVar58);
              pvVar43 = (void *)((long)pvVar42 + lVar58);
              pvVar41 = (void *)(lVar58 + (long)pvVar45);
            }
            auVar104 = auVar111._0_32_;
            auVar94 = auVar100._0_32_;
            auVar81 = auVar85._0_32_;
            if (iVar55 < 1) {
              pvVar77 = (void *)(lVar63 * uVar39 + (long)pvVar71);
              pvVar48 = (void *)((uVar39 + uVar72) * lVar63 + (long)pvVar71);
              pvVar59 = (void *)(lVar74 * lVar63 + (long)pvVar71);
              pvVar65 = (void *)(lVar38 * lVar63 + (long)pvVar71);
              pvVar64 = local_2e0;
            }
            else {
              lVar74 = 0;
              auVar122 = in_ZMM6;
              uVar27 = uVar25;
              do {
                pfVar3 = (float *)((long)local_2e0 + lVar74);
                fVar123 = *pfVar3;
                fVar133 = pfVar3[1];
                fVar129 = pfVar3[2];
                fVar138 = pfVar3[3];
                fVar130 = pfVar3[4];
                fVar139 = pfVar3[5];
                fVar131 = pfVar3[6];
                pfVar4 = (float *)((long)pvVar67 + lVar74);
                auVar94._0_4_ = fVar123 * *pfVar4 + auVar100._0_4_;
                auVar94._4_4_ = fVar133 * pfVar4[1] + auVar100._4_4_;
                auVar94._8_4_ = fVar129 * pfVar4[2] + auVar100._8_4_;
                auVar94._12_4_ = fVar138 * pfVar4[3] + auVar100._12_4_;
                auVar94._16_4_ = fVar130 * pfVar4[4] + auVar100._16_4_;
                auVar94._20_4_ = fVar139 * pfVar4[5] + auVar100._20_4_;
                auVar94._24_4_ = fVar131 * pfVar4[6] + auVar100._24_4_;
                fVar132 = in_ZMM5._28_4_;
                auVar94._28_4_ = fVar132 + auVar100._28_4_;
                auVar100 = ZEXT3264(auVar94);
                pfVar4 = (float *)((long)pvVar51 + lVar74);
                in_ZMM5 = ZEXT3264(CONCAT428(fVar132,CONCAT424(fVar131 * pfVar4[6],
                                                               CONCAT420(fVar139 * pfVar4[5],
                                                                         CONCAT416(fVar130 * pfVar4[
                                                  4],CONCAT412(fVar138 * pfVar4[3],
                                                               CONCAT48(fVar129 * pfVar4[2],
                                                                        CONCAT44(fVar133 * pfVar4[1]
                                                                                 ,fVar123 * *pfVar4)
                                                                       )))))));
                pfVar5 = (float *)((long)pvVar47 + lVar74);
                auVar137._0_4_ = fVar123 * *pfVar5;
                auVar137._4_4_ = fVar133 * pfVar5[1];
                auVar137._8_4_ = fVar129 * pfVar5[2];
                auVar137._12_4_ = fVar138 * pfVar5[3];
                auVar137._16_4_ = fVar130 * pfVar5[4];
                auVar137._20_4_ = fVar139 * pfVar5[5];
                auVar137._28_36_ = auVar122._28_36_;
                auVar137._24_4_ = fVar131 * pfVar5[6];
                in_ZMM6 = ZEXT3264(auVar137._0_32_);
                auVar104._0_4_ = fVar123 * *pfVar4 + auVar111._0_4_;
                auVar104._4_4_ = fVar133 * pfVar4[1] + auVar111._4_4_;
                auVar104._8_4_ = fVar129 * pfVar4[2] + auVar111._8_4_;
                auVar104._12_4_ = fVar138 * pfVar4[3] + auVar111._12_4_;
                auVar104._16_4_ = fVar130 * pfVar4[4] + auVar111._16_4_;
                auVar104._20_4_ = fVar139 * pfVar4[5] + auVar111._20_4_;
                auVar104._24_4_ = fVar131 * pfVar4[6] + auVar111._24_4_;
                auVar104._28_4_ = fVar132 + auVar111._28_4_;
                auVar111 = ZEXT3264(auVar104);
                in_ZMM3 = ZEXT3264(CONCAT428(auVar122._28_4_ + in_ZMM3._28_4_,
                                             CONCAT424(auVar137._24_4_ + in_ZMM3._24_4_,
                                                       CONCAT420(auVar137._20_4_ + in_ZMM3._20_4_,
                                                                 CONCAT416(auVar137._16_4_ +
                                                                           in_ZMM3._16_4_,
                                                                           CONCAT412(auVar137._12_4_
                                                                                     + in_ZMM3.
                                                  _12_4_,CONCAT48(auVar137._8_4_ + in_ZMM3._8_4_,
                                                                  CONCAT44(auVar137._4_4_ +
                                                                           in_ZMM3._4_4_,
                                                                           auVar137._0_4_ +
                                                                           in_ZMM3._0_4_))))))));
                pfVar4 = (float *)((long)local_2d0 + lVar74);
                auVar81._0_4_ = fVar123 * *pfVar4 + auVar85._0_4_;
                auVar81._4_4_ = fVar133 * pfVar4[1] + auVar85._4_4_;
                auVar81._8_4_ = fVar129 * pfVar4[2] + auVar85._8_4_;
                auVar81._12_4_ = fVar138 * pfVar4[3] + auVar85._12_4_;
                auVar81._16_4_ = fVar130 * pfVar4[4] + auVar85._16_4_;
                auVar81._20_4_ = fVar139 * pfVar4[5] + auVar85._20_4_;
                auVar81._24_4_ = fVar131 * pfVar4[6] + auVar85._24_4_;
                auVar81._28_4_ = pfVar3[7] + auVar85._28_4_;
                auVar85 = ZEXT3264(auVar81);
                uVar27 = uVar27 - 1;
                lVar74 = lVar74 + 0x20;
                auVar122 = in_ZMM6;
              } while (1 < uVar27);
              pvVar65 = (void *)((long)local_2d0 + lVar74);
              pvVar59 = (void *)((long)pvVar47 + lVar74);
              pvVar48 = (void *)((long)pvVar51 + lVar74);
              pvVar77 = (void *)((long)pvVar67 + lVar74);
              pvVar64 = (void *)(lVar74 + (long)local_2e0);
            }
            auVar79 = vhaddps_avx(in_ZMM3._0_32_,auVar81);
            auVar93 = vhaddps_avx(auVar94,auVar104);
            auVar79 = vhaddps_avx(auVar93,auVar79);
            auVar92 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar46 + uVar39 * 4)),
                                    ZEXT416(*(uint *)((long)pvVar46 + uVar39 * 4 + lVar32)),0x10);
            auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)((long)pvVar46 +
                                                             uVar39 * 4 + lVar32 * 2)),0x20);
            auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)((long)pvVar46 +
                                                             uVar39 * 4 + lVar32 * 3)),0x30);
            auVar85 = ZEXT1664(CONCAT412(auVar92._12_4_ + auVar79._12_4_ + auVar79._28_4_,
                                         CONCAT48(auVar92._8_4_ + auVar79._8_4_ + auVar79._24_4_,
                                                  CONCAT44(auVar92._4_4_ + auVar79._4_4_ +
                                                           auVar79._20_4_,
                                                           auVar92._0_4_ + auVar79._0_4_ +
                                                           auVar79._16_4_))));
            if (uVar73 != 0) {
              lVar74 = 0;
              iVar34 = uVar73 + 1;
              do {
                auVar92 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar43 + lVar74)),
                                        ZEXT416(*(uint *)((long)pvVar33 + lVar74)),0x10);
                auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)((long)pvVar75 + lVar74)),0x20);
                auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)((long)pvVar68 + lVar74)),0x30);
                fVar123 = *(float *)((long)pvVar41 + lVar74);
                auVar85 = ZEXT1664(CONCAT412(auVar92._12_4_ * fVar123 + auVar85._12_4_,
                                             CONCAT48(auVar92._8_4_ * fVar123 + auVar85._8_4_,
                                                      CONCAT44(auVar92._4_4_ * fVar123 +
                                                               auVar85._4_4_,
                                                               auVar92._0_4_ * fVar123 +
                                                               auVar85._0_4_))));
                iVar34 = iVar34 + -1;
                lVar74 = lVar74 + 4;
              } while (1 < iVar34);
            }
            auVar92 = auVar85._0_16_;
            if (uVar57 != 0) {
              lVar74 = 0;
              iVar34 = iVar26;
              do {
                auVar92 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar77 + lVar74)),
                                        ZEXT416(*(uint *)((long)pvVar48 + lVar74)),0x10);
                auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)((long)pvVar59 + lVar74)),0x20);
                auVar148 = vinsertps_avx(auVar92,ZEXT416(*(uint *)((long)pvVar65 + lVar74)),0x30);
                fVar123 = *(float *)((long)pvVar64 + lVar74);
                auVar92._0_4_ = auVar148._0_4_ * fVar123 + auVar85._0_4_;
                auVar92._4_4_ = auVar148._4_4_ * fVar123 + auVar85._4_4_;
                auVar92._8_4_ = auVar148._8_4_ * fVar123 + auVar85._8_4_;
                auVar92._12_4_ = auVar148._12_4_ * fVar123 + auVar85._12_4_;
                auVar85 = ZEXT1664(auVar92);
                iVar34 = iVar34 + -1;
                lVar74 = lVar74 + 4;
              } while (1 < iVar34);
            }
            *(int *)((long)(_func_int ***)local_78.data + uVar39 * 4) = auVar92._0_4_;
            uVar7 = vextractps_avx(auVar92,1);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar39 * 4 + lVar31) = uVar7;
            uVar7 = vextractps_avx(auVar92,2);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar39 * 4 + lVar31 * 2) = uVar7;
            uVar7 = vextractps_avx(auVar92,3);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar39 * 4 + lVar54) = uVar7;
            uVar39 = uVar39 + 1;
            pvVar61 = (void *)((long)pvVar61 + lVar30);
            pvVar37 = (void *)((long)pvVar37 + lVar30);
            pvVar56 = (void *)((long)pvVar56 + lVar30);
            pvVar42 = (void *)((long)pvVar42 + lVar30);
            local_2d0 = (void *)((long)local_2d0 + lVar63);
            pvVar47 = (void *)((long)pvVar47 + lVar63);
            pvVar51 = (void *)((long)pvVar51 + lVar63);
            pvVar67 = (void *)((long)pvVar67 + lVar63);
          } while ((long)uVar39 < (long)uVar72);
        }
        pvVar71 = (void *)((long)top_blob->w * (long)(int)uVar35 * top_blob->elemsize +
                          (long)top_blob->data);
        ppp_Var44 = (_func_int ***)((long)(_func_int ***)local_78.data + local_78.elemsize * lVar29)
        ;
        pvVar52 = (void *)((long)(_func_int ***)local_78.data + local_78.elemsize * lVar29 * 2);
        lVar54 = (long)(_func_int ***)local_78.data + lVar54;
        pvVar46 = cell_state->data;
        pAVar60 = (Allocator *)local_78.data;
        if (0 < iVar55) {
          auVar148._8_4_ = 0x3f800000;
          auVar148._0_8_ = 0x3f8000003f800000;
          auVar148._12_4_ = 0x3f800000;
          in_ZMM9 = ZEXT1664(auVar148);
          lVar29 = 0;
          uVar35 = uVar25;
          do {
            lVar32 = lVar29;
            auVar79 = *(undefined1 (*) [32])((long)(_func_int ***)local_78.data + lVar32);
            auVar82._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
            auVar82._8_4_ = auVar79._8_4_ ^ 0x80000000;
            auVar82._12_4_ = auVar79._12_4_ ^ 0x80000000;
            auVar82._16_4_ = auVar79._16_4_ ^ 0x80000000;
            auVar82._20_4_ = auVar79._20_4_ ^ 0x80000000;
            auVar82._24_4_ = auVar79._24_4_ ^ 0x80000000;
            auVar82._28_4_ = auVar79._28_4_ ^ 0x80000000;
            auVar149._8_4_ = 0x42b0c0a5;
            auVar149._0_8_ = 0x42b0c0a542b0c0a5;
            auVar149._12_4_ = 0x42b0c0a5;
            auVar149._16_4_ = 0x42b0c0a5;
            auVar149._20_4_ = 0x42b0c0a5;
            auVar149._24_4_ = 0x42b0c0a5;
            auVar149._28_4_ = 0x42b0c0a5;
            in_ZMM10 = ZEXT3264(auVar149);
            auVar79 = vminps_avx(auVar149,auVar82);
            auVar95._8_4_ = 0xc2b0c0a5;
            auVar95._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar95._12_4_ = 0xc2b0c0a5;
            auVar95._16_4_ = 0xc2b0c0a5;
            auVar95._20_4_ = 0xc2b0c0a5;
            auVar95._24_4_ = 0xc2b0c0a5;
            auVar95._28_4_ = 0xc2b0c0a5;
            auVar93 = vmaxps_avx(auVar79,auVar95);
            auVar96._0_4_ = auVar93._0_4_ * 1.442695 + 0.5;
            auVar96._4_4_ = auVar93._4_4_ * 1.442695 + 0.5;
            auVar96._8_4_ = auVar93._8_4_ * 1.442695 + 0.5;
            auVar96._12_4_ = auVar93._12_4_ * 1.442695 + 0.5;
            auVar96._16_4_ = auVar93._16_4_ * 1.442695 + 0.5;
            auVar96._20_4_ = auVar93._20_4_ * 1.442695 + 0.5;
            auVar96._24_4_ = auVar93._24_4_ * 1.442695 + 0.5;
            auVar96._28_4_ = 0xc2afc0a5;
            auVar103 = vroundps_avx(auVar96,1);
            auVar79 = vcmpps_avx(auVar96,auVar103,1);
            auVar79 = vandps_avx(auVar79,auVar145);
            auVar79 = vsubps_avx(auVar103,auVar79);
            auVar11._4_4_ = auVar79._4_4_ * 0.6931472;
            auVar11._0_4_ = auVar79._0_4_ * 0.6931472;
            auVar11._8_4_ = auVar79._8_4_ * 0.6931472;
            auVar11._12_4_ = auVar79._12_4_ * 0.6931472;
            auVar11._16_4_ = auVar79._16_4_ * 0.6931472;
            auVar11._20_4_ = auVar79._20_4_ * 0.6931472;
            auVar11._24_4_ = auVar79._24_4_ * 0.6931472;
            auVar11._28_4_ = auVar103._28_4_;
            auVar93 = vsubps_avx(auVar93,auVar11);
            fVar123 = auVar93._0_4_;
            fVar133 = auVar93._4_4_;
            fVar129 = auVar93._8_4_;
            fVar138 = auVar93._12_4_;
            fVar130 = auVar93._16_4_;
            fVar139 = auVar93._20_4_;
            fVar131 = auVar93._24_4_;
            auVar101._0_4_ = (int)auVar79._0_4_;
            auVar101._4_4_ = (int)auVar79._4_4_;
            auVar101._8_4_ = (int)auVar79._8_4_;
            auVar101._12_4_ = (int)auVar79._12_4_;
            auVar97._16_4_ = (int)auVar79._16_4_;
            auVar97._0_16_ = auVar101;
            auVar97._20_4_ = (int)auVar79._20_4_;
            auVar97._24_4_ = (int)auVar79._24_4_;
            auVar97._28_4_ = (int)auVar79._28_4_;
            auVar101 = vpslld_avx(auVar101,0x17);
            auVar92 = vpslld_avx(auVar97._16_16_,0x17);
            auVar92 = vpaddd_avx(auVar148,auVar92);
            auVar101 = vpaddd_avx(auVar148,auVar101);
            auVar105._0_4_ =
                 (fVar123 + 1.0 +
                 fVar123 * fVar123 *
                 (((((fVar123 * 0.00019875691 + 0.0013981999) * fVar123 + 0.008333452) * fVar123 +
                   0.041665796) * fVar123 + 0.16666666) * fVar123 + 0.5)) * auVar101._0_4_ + 1.0;
            auVar105._4_4_ =
                 (fVar133 + 1.0 +
                 fVar133 * fVar133 *
                 (((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) * fVar133 +
                   0.041665796) * fVar133 + 0.16666666) * fVar133 + 0.5)) * auVar101._4_4_ + 1.0;
            auVar105._8_4_ =
                 (fVar129 + 1.0 +
                 fVar129 * fVar129 *
                 (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) * fVar129 +
                   0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5)) * auVar101._8_4_ + 1.0;
            auVar105._12_4_ =
                 (fVar138 + 1.0 +
                 fVar138 * fVar138 *
                 (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) * fVar138 +
                   0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5)) * auVar101._12_4_ + 1.0;
            auVar105._16_4_ =
                 (fVar130 + 1.0 +
                 fVar130 * fVar130 *
                 (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                   0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5)) * auVar92._0_4_ + 1.0;
            auVar105._20_4_ =
                 (fVar139 + 1.0 +
                 fVar139 * fVar139 *
                 (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                   0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5)) * auVar92._4_4_ + 1.0;
            auVar105._24_4_ =
                 (fVar131 + 1.0 +
                 fVar131 * fVar131 *
                 (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                   0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar92._8_4_ + 1.0;
            auVar105._28_4_ = auVar93._28_4_ + 1.0 + auVar103._28_4_ + 1.0;
            auVar103 = vrcpps_avx(auVar105);
            pfVar3 = (float *)(lVar54 + lVar32);
            auVar12._4_4_ = pfVar3[1] * -2.0;
            auVar12._0_4_ = *pfVar3 * -2.0;
            auVar12._8_4_ = pfVar3[2] * -2.0;
            auVar12._12_4_ = pfVar3[3] * -2.0;
            auVar12._16_4_ = pfVar3[4] * -2.0;
            auVar12._20_4_ = pfVar3[5] * -2.0;
            auVar12._24_4_ = pfVar3[6] * -2.0;
            auVar12._28_4_ = 0xc0000000;
            auVar79 = vminps_avx(auVar149,auVar12);
            auVar93 = vmaxps_avx(auVar79,auVar95);
            auVar115._0_4_ = auVar93._0_4_ * 1.442695 + 0.5;
            auVar115._4_4_ = auVar93._4_4_ * 1.442695 + 0.5;
            auVar115._8_4_ = auVar93._8_4_ * 1.442695 + 0.5;
            auVar115._12_4_ = auVar93._12_4_ * 1.442695 + 0.5;
            auVar115._16_4_ = auVar93._16_4_ * 1.442695 + 0.5;
            auVar115._20_4_ = auVar93._20_4_ * 1.442695 + 0.5;
            auVar115._24_4_ = auVar93._24_4_ * 1.442695 + 0.5;
            auVar115._28_4_ =
                 in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 + 0.5;
            auVar114 = vroundps_avx(auVar115,1);
            auVar79 = vcmpps_avx(auVar115,auVar114,1);
            auVar79 = vandps_avx(auVar79,auVar145);
            auVar79 = vsubps_avx(auVar114,auVar79);
            auVar13._4_4_ = auVar79._4_4_ * 0.6931472;
            auVar13._0_4_ = auVar79._0_4_ * 0.6931472;
            auVar13._8_4_ = auVar79._8_4_ * 0.6931472;
            auVar13._12_4_ = auVar79._12_4_ * 0.6931472;
            auVar13._16_4_ = auVar79._16_4_ * 0.6931472;
            auVar13._20_4_ = auVar79._20_4_ * 0.6931472;
            auVar13._24_4_ = auVar79._24_4_ * 0.6931472;
            auVar13._28_4_ = auVar114._28_4_;
            auVar93 = vsubps_avx(auVar93,auVar13);
            fVar123 = auVar93._0_4_;
            fVar133 = auVar93._4_4_;
            fVar129 = auVar93._8_4_;
            fVar138 = auVar93._12_4_;
            fVar130 = auVar93._16_4_;
            fVar139 = auVar93._20_4_;
            fVar131 = auVar93._24_4_;
            auVar112._0_4_ = (int)auVar79._0_4_;
            auVar112._4_4_ = (int)auVar79._4_4_;
            auVar112._8_4_ = (int)auVar79._8_4_;
            auVar112._12_4_ = (int)auVar79._12_4_;
            auVar116._16_4_ = (int)auVar79._16_4_;
            auVar116._0_16_ = auVar112;
            auVar116._20_4_ = (int)auVar79._20_4_;
            auVar116._24_4_ = (int)auVar79._24_4_;
            auVar116._28_4_ = (int)auVar79._28_4_;
            auVar101 = vpslld_avx(auVar112,0x17);
            auVar92 = vpslld_avx(auVar116._16_16_,0x17);
            auVar92 = vpaddd_avx(auVar148,auVar92);
            auVar101 = vpaddd_avx(auVar148,auVar101);
            auVar83._0_4_ =
                 (fVar123 + 1.0 +
                 fVar123 * fVar123 *
                 (((((fVar123 * 0.00019875691 + 0.0013981999) * fVar123 + 0.008333452) * fVar123 +
                   0.041665796) * fVar123 + 0.16666666) * fVar123 + 0.5)) * auVar101._0_4_ + 1.0;
            auVar83._4_4_ =
                 (fVar133 + 1.0 +
                 fVar133 * fVar133 *
                 (((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) * fVar133 +
                   0.041665796) * fVar133 + 0.16666666) * fVar133 + 0.5)) * auVar101._4_4_ + 1.0;
            auVar83._8_4_ =
                 (fVar129 + 1.0 +
                 fVar129 * fVar129 *
                 (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) * fVar129 +
                   0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5)) * auVar101._8_4_ + 1.0;
            auVar83._12_4_ =
                 (fVar138 + 1.0 +
                 fVar138 * fVar138 *
                 (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) * fVar138 +
                   0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5)) * auVar101._12_4_ + 1.0;
            auVar83._16_4_ =
                 (fVar130 + 1.0 +
                 fVar130 * fVar130 *
                 (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                   0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5)) * auVar92._0_4_ + 1.0;
            auVar83._20_4_ =
                 (fVar139 + 1.0 +
                 fVar139 * fVar139 *
                 (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                   0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5)) * auVar92._4_4_ + 1.0;
            auVar83._24_4_ =
                 (fVar131 + 1.0 +
                 fVar131 * fVar131 *
                 (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                   0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar92._8_4_ + 1.0;
            auVar83._28_4_ = auVar93._28_4_ + 1.0 + auVar114._28_4_ + 1.0;
            auVar79 = vrcpps_avx(auVar83);
            fVar123 = auVar79._0_4_;
            fVar133 = auVar79._4_4_;
            fVar129 = auVar79._8_4_;
            fVar138 = auVar79._12_4_;
            fVar130 = auVar79._16_4_;
            fVar139 = auVar79._20_4_;
            fVar131 = auVar79._24_4_;
            auVar14._4_4_ = auVar83._4_4_ * (fVar133 + fVar133);
            auVar14._0_4_ = auVar83._0_4_ * (fVar123 + fVar123);
            auVar14._8_4_ = auVar83._8_4_ * (fVar129 + fVar129);
            auVar14._12_4_ = auVar83._12_4_ * (fVar138 + fVar138);
            auVar14._16_4_ = auVar83._16_4_ * (fVar130 + fVar130);
            auVar14._20_4_ = auVar83._20_4_ * (fVar139 + fVar139);
            auVar14._24_4_ = auVar83._24_4_ * (fVar131 + fVar131);
            auVar14._28_4_ = auVar83._28_4_;
            auVar135._8_4_ = 0x40000000;
            auVar135._0_8_ = 0x4000000040000000;
            auVar135._12_4_ = 0x40000000;
            auVar135._16_4_ = 0x40000000;
            auVar135._20_4_ = 0x40000000;
            auVar135._24_4_ = 0x40000000;
            auVar135._28_4_ = 0x40000000;
            auVar93 = vsubps_avx(auVar135,auVar14);
            fVar132 = auVar93._28_4_;
            auVar117._0_4_ = fVar123 + fVar123 + -1.0 + fVar123 * auVar93._0_4_;
            auVar117._4_4_ = fVar133 + fVar133 + -1.0 + fVar133 * auVar93._4_4_;
            auVar117._8_4_ = fVar129 + fVar129 + -1.0 + fVar129 * auVar93._8_4_;
            auVar117._12_4_ = fVar138 + fVar138 + -1.0 + fVar138 * auVar93._12_4_;
            auVar117._16_4_ = fVar130 + fVar130 + -1.0 + fVar130 * auVar93._16_4_;
            auVar117._20_4_ = fVar139 + fVar139 + -1.0 + fVar139 * auVar93._20_4_;
            auVar117._24_4_ = fVar131 + fVar131 + -1.0 + fVar131 * auVar93._24_4_;
            auVar117._28_4_ = auVar79._28_4_ + auVar79._28_4_ + -1.0 + fVar132;
            fVar78 = auVar117._0_4_ * auVar103._0_4_;
            fVar86 = auVar117._4_4_ * auVar103._4_4_;
            fVar87 = auVar117._8_4_ * auVar103._8_4_;
            fVar88 = auVar117._12_4_ * auVar103._12_4_;
            fVar89 = auVar117._16_4_ * auVar103._16_4_;
            fVar90 = auVar117._20_4_ * auVar103._20_4_;
            fVar91 = auVar117._24_4_ * auVar103._24_4_;
            auVar15._4_4_ = auVar105._4_4_ * fVar86;
            auVar15._0_4_ = auVar105._0_4_ * fVar78;
            auVar15._8_4_ = auVar105._8_4_ * fVar87;
            auVar15._12_4_ = auVar105._12_4_ * fVar88;
            auVar15._16_4_ = auVar105._16_4_ * fVar89;
            auVar15._20_4_ = auVar105._20_4_ * fVar90;
            auVar15._24_4_ = auVar105._24_4_ * fVar91;
            auVar15._28_4_ = auVar105._28_4_;
            auVar134 = vsubps_avx(auVar117,auVar15);
            auVar79 = *(undefined1 (*) [32])((long)ppp_Var44 + lVar32);
            auVar106._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
            auVar106._8_4_ = auVar79._8_4_ ^ 0x80000000;
            auVar106._12_4_ = auVar79._12_4_ ^ 0x80000000;
            auVar106._16_4_ = auVar79._16_4_ ^ 0x80000000;
            auVar106._20_4_ = auVar79._20_4_ ^ 0x80000000;
            auVar106._24_4_ = auVar79._24_4_ ^ 0x80000000;
            auVar106._28_4_ = auVar79._28_4_ ^ 0x80000000;
            auVar79 = vminps_avx(auVar149,auVar106);
            auVar144._8_4_ = 0xc2b0c0a5;
            auVar144._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar144._12_4_ = 0xc2b0c0a5;
            auVar144._16_4_ = 0xc2b0c0a5;
            auVar144._20_4_ = 0xc2b0c0a5;
            auVar144._24_4_ = 0xc2b0c0a5;
            auVar144._28_4_ = 0xc2b0c0a5;
            auVar93 = vmaxps_avx(auVar79,auVar144);
            auVar118._0_4_ = auVar93._0_4_ * 1.442695 + 0.5;
            auVar118._4_4_ = auVar93._4_4_ * 1.442695 + 0.5;
            auVar118._8_4_ = auVar93._8_4_ * 1.442695 + 0.5;
            auVar118._12_4_ = auVar93._12_4_ * 1.442695 + 0.5;
            auVar118._16_4_ = auVar93._16_4_ * 1.442695 + 0.5;
            auVar118._20_4_ = auVar93._20_4_ * 1.442695 + 0.5;
            auVar118._24_4_ = auVar93._24_4_ * 1.442695 + 0.5;
            auVar118._28_4_ = auVar117._28_4_ + 0.5;
            auVar114 = vroundps_avx(auVar118,1);
            auVar79 = vcmpps_avx(auVar118,auVar114,1);
            auVar79 = vandps_avx(auVar79,auVar145);
            auVar79 = vsubps_avx(auVar114,auVar79);
            auVar16._4_4_ = auVar79._4_4_ * 0.6931472;
            auVar16._0_4_ = auVar79._0_4_ * 0.6931472;
            auVar16._8_4_ = auVar79._8_4_ * 0.6931472;
            auVar16._12_4_ = auVar79._12_4_ * 0.6931472;
            auVar16._16_4_ = auVar79._16_4_ * 0.6931472;
            auVar16._20_4_ = auVar79._20_4_ * 0.6931472;
            auVar16._24_4_ = auVar79._24_4_ * 0.6931472;
            auVar16._28_4_ = auVar114._28_4_;
            auVar93 = vsubps_avx(auVar93,auVar16);
            fVar123 = auVar93._0_4_;
            fVar133 = auVar93._4_4_;
            fVar129 = auVar93._8_4_;
            fVar138 = auVar93._12_4_;
            fVar130 = auVar93._16_4_;
            fVar139 = auVar93._20_4_;
            fVar131 = auVar93._24_4_;
            auVar113._0_4_ = (int)auVar79._0_4_;
            auVar113._4_4_ = (int)auVar79._4_4_;
            auVar113._8_4_ = (int)auVar79._8_4_;
            auVar113._12_4_ = (int)auVar79._12_4_;
            auVar119._16_4_ = (int)auVar79._16_4_;
            auVar119._0_16_ = auVar113;
            auVar119._20_4_ = (int)auVar79._20_4_;
            auVar119._24_4_ = (int)auVar79._24_4_;
            auVar119._28_4_ = (int)auVar79._28_4_;
            auVar101 = vpslld_avx(auVar113,0x17);
            auVar92 = vpslld_avx(auVar119._16_16_,0x17);
            auVar92 = vpaddd_avx(auVar148,auVar92);
            auVar101 = vpaddd_avx(auVar148,auVar101);
            auVar107._0_4_ =
                 (fVar123 + 1.0 +
                 fVar123 * fVar123 *
                 (((((fVar123 * 0.00019875691 + 0.0013981999) * fVar123 + 0.008333452) * fVar123 +
                   0.041665796) * fVar123 + 0.16666666) * fVar123 + 0.5)) * auVar101._0_4_ + 1.0;
            auVar107._4_4_ =
                 (fVar133 + 1.0 +
                 fVar133 * fVar133 *
                 (((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) * fVar133 +
                   0.041665796) * fVar133 + 0.16666666) * fVar133 + 0.5)) * auVar101._4_4_ + 1.0;
            auVar107._8_4_ =
                 (fVar129 + 1.0 +
                 fVar129 * fVar129 *
                 (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) * fVar129 +
                   0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5)) * auVar101._8_4_ + 1.0;
            auVar107._12_4_ =
                 (fVar138 + 1.0 +
                 fVar138 * fVar138 *
                 (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) * fVar138 +
                   0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5)) * auVar101._12_4_ + 1.0;
            auVar107._16_4_ =
                 (fVar130 + 1.0 +
                 fVar130 * fVar130 *
                 (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                   0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5)) * auVar92._0_4_ + 1.0;
            auVar107._20_4_ =
                 (fVar139 + 1.0 +
                 fVar139 * fVar139 *
                 (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                   0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5)) * auVar92._4_4_ + 1.0;
            auVar107._24_4_ =
                 (fVar131 + 1.0 +
                 fVar131 * fVar131 *
                 (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                   0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar92._8_4_ + 1.0;
            auVar107._28_4_ = auVar93._28_4_ + 1.0 + auVar114._28_4_ + 1.0;
            auVar114 = vrcpps_avx(auVar107);
            auVar79 = *(undefined1 (*) [32])((long)pvVar46 + lVar32);
            fVar133 = auVar79._0_4_ * auVar114._0_4_;
            fVar138 = auVar79._4_4_ * auVar114._4_4_;
            fVar139 = auVar79._8_4_ * auVar114._8_4_;
            fVar140 = auVar79._12_4_ * auVar114._12_4_;
            fVar141 = auVar79._16_4_ * auVar114._16_4_;
            fVar142 = auVar79._20_4_ * auVar114._20_4_;
            fVar143 = auVar79._24_4_ * auVar114._24_4_;
            auVar17._4_4_ = auVar107._4_4_ * fVar138;
            auVar17._0_4_ = auVar107._0_4_ * fVar133;
            auVar17._8_4_ = auVar107._8_4_ * fVar139;
            auVar17._12_4_ = auVar107._12_4_ * fVar140;
            auVar17._16_4_ = auVar107._16_4_ * fVar141;
            auVar17._20_4_ = auVar107._20_4_ * fVar142;
            auVar17._24_4_ = auVar107._24_4_ * fVar143;
            auVar17._28_4_ = auVar107._28_4_;
            auVar146 = vsubps_avx(auVar79,auVar17);
            auVar93 = *(undefined1 (*) [32])((long)pvVar52 + lVar32);
            auVar120._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
            auVar120._8_4_ = auVar93._8_4_ ^ 0x80000000;
            auVar120._12_4_ = auVar93._12_4_ ^ 0x80000000;
            auVar120._16_4_ = auVar93._16_4_ ^ 0x80000000;
            auVar120._20_4_ = auVar93._20_4_ ^ 0x80000000;
            auVar120._24_4_ = auVar93._24_4_ ^ 0x80000000;
            auVar120._28_4_ = auVar93._28_4_ ^ 0x80000000;
            auVar93 = vminps_avx(auVar149,auVar120);
            auVar93 = vmaxps_avx(auVar93,auVar144);
            auVar126._0_4_ = auVar93._0_4_ * 1.442695 + 0.5;
            auVar126._4_4_ = auVar93._4_4_ * 1.442695 + 0.5;
            auVar126._8_4_ = auVar93._8_4_ * 1.442695 + 0.5;
            auVar126._12_4_ = auVar93._12_4_ * 1.442695 + 0.5;
            auVar126._16_4_ = auVar93._16_4_ * 1.442695 + 0.5;
            auVar126._20_4_ = auVar93._20_4_ * 1.442695 + 0.5;
            auVar126._24_4_ = auVar93._24_4_ * 1.442695 + 0.5;
            auVar126._28_4_ = auVar79._28_4_ + 0.5;
            auVar125 = vroundps_avx(auVar126,1);
            auVar79 = vcmpps_avx(auVar126,auVar125,1);
            auVar79 = vandps_avx(auVar79,auVar145);
            auVar79 = vsubps_avx(auVar125,auVar79);
            auVar18._4_4_ = auVar79._4_4_ * 0.6931472;
            auVar18._0_4_ = auVar79._0_4_ * 0.6931472;
            auVar18._8_4_ = auVar79._8_4_ * 0.6931472;
            auVar18._12_4_ = auVar79._12_4_ * 0.6931472;
            auVar18._16_4_ = auVar79._16_4_ * 0.6931472;
            auVar18._20_4_ = auVar79._20_4_ * 0.6931472;
            auVar18._24_4_ = auVar79._24_4_ * 0.6931472;
            auVar18._28_4_ = auVar125._28_4_;
            auVar80 = vsubps_avx(auVar93,auVar18);
            fVar123 = auVar80._0_4_;
            fVar129 = auVar80._4_4_;
            fVar130 = auVar80._8_4_;
            fVar131 = auVar80._12_4_;
            fVar150 = auVar80._16_4_;
            fVar8 = auVar80._20_4_;
            fVar9 = auVar80._24_4_;
            auVar124._0_4_ = (int)auVar79._0_4_;
            auVar124._4_4_ = (int)auVar79._4_4_;
            auVar124._8_4_ = (int)auVar79._8_4_;
            auVar124._12_4_ = (int)auVar79._12_4_;
            auVar127._16_4_ = (int)auVar79._16_4_;
            auVar127._0_16_ = auVar124;
            auVar127._20_4_ = (int)auVar79._20_4_;
            auVar127._24_4_ = (int)auVar79._24_4_;
            auVar127._28_4_ = (int)auVar79._28_4_;
            auVar101 = vpslld_avx(auVar124,0x17);
            auVar92 = vpslld_avx(auVar127._16_16_,0x17);
            auVar92 = vpaddd_avx(auVar148,auVar92);
            auVar101 = vpaddd_avx(auVar148,auVar101);
            auVar84._0_4_ =
                 fVar133 + auVar114._0_4_ * auVar146._0_4_ + fVar78 +
                 auVar103._0_4_ * auVar134._0_4_;
            auVar84._4_4_ =
                 fVar138 + auVar114._4_4_ * auVar146._4_4_ + fVar86 +
                 auVar103._4_4_ * auVar134._4_4_;
            auVar84._8_4_ =
                 fVar139 + auVar114._8_4_ * auVar146._8_4_ + fVar87 +
                 auVar103._8_4_ * auVar134._8_4_;
            auVar84._12_4_ =
                 fVar140 + auVar114._12_4_ * auVar146._12_4_ + fVar88 +
                 auVar103._12_4_ * auVar134._12_4_;
            auVar84._16_4_ =
                 fVar141 + auVar114._16_4_ * auVar146._16_4_ + fVar89 +
                 auVar103._16_4_ * auVar134._16_4_;
            auVar84._20_4_ =
                 fVar142 + auVar114._20_4_ * auVar146._20_4_ + fVar90 +
                 auVar103._20_4_ * auVar134._20_4_;
            auVar84._24_4_ =
                 fVar143 + auVar114._24_4_ * auVar146._24_4_ + fVar91 +
                 auVar103._24_4_ * auVar134._24_4_;
            auVar84._28_4_ = auVar146._28_4_ + 2.718064 + fVar132 + fVar132;
            auVar19._4_4_ = auVar84._4_4_ * -2.0;
            auVar19._0_4_ = auVar84._0_4_ * -2.0;
            auVar19._8_4_ = auVar84._8_4_ * -2.0;
            auVar19._12_4_ = auVar84._12_4_ * -2.0;
            auVar19._16_4_ = auVar84._16_4_ * -2.0;
            auVar19._20_4_ = auVar84._20_4_ * -2.0;
            auVar19._24_4_ = auVar84._24_4_ * -2.0;
            auVar19._28_4_ = 0xc0000000;
            auVar79 = vminps_avx(auVar149,auVar19);
            auVar108._8_4_ = 0xc2b0c0a5;
            auVar108._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar108._12_4_ = 0xc2b0c0a5;
            auVar108._16_4_ = 0xc2b0c0a5;
            auVar108._20_4_ = 0xc2b0c0a5;
            auVar108._24_4_ = 0xc2b0c0a5;
            auVar108._28_4_ = 0xc2b0c0a5;
            auVar93 = vmaxps_avx(auVar79,auVar108);
            auVar109._0_4_ = auVar93._0_4_ * 1.442695 + 0.5;
            auVar109._4_4_ = auVar93._4_4_ * 1.442695 + 0.5;
            auVar109._8_4_ = auVar93._8_4_ * 1.442695 + 0.5;
            auVar109._12_4_ = auVar93._12_4_ * 1.442695 + 0.5;
            auVar109._16_4_ = auVar93._16_4_ * 1.442695 + 0.5;
            auVar109._20_4_ = auVar93._20_4_ * 1.442695 + 0.5;
            auVar109._24_4_ = auVar93._24_4_ * 1.442695 + 0.5;
            auVar109._28_4_ = 0xc2afc0a5;
            auVar103 = vroundps_avx(auVar109,1);
            auVar79 = vcmpps_avx(auVar109,auVar103,1);
            auVar79 = vandps_avx(auVar79,auVar145);
            auVar79 = vsubps_avx(auVar103,auVar79);
            auVar20._4_4_ = auVar79._4_4_ * 0.6931472;
            auVar20._0_4_ = auVar79._0_4_ * 0.6931472;
            auVar20._8_4_ = auVar79._8_4_ * 0.6931472;
            auVar20._12_4_ = auVar79._12_4_ * 0.6931472;
            auVar20._16_4_ = auVar79._16_4_ * 0.6931472;
            auVar20._20_4_ = auVar79._20_4_ * 0.6931472;
            auVar20._24_4_ = auVar79._24_4_ * 0.6931472;
            auVar20._28_4_ = auVar103._28_4_;
            auVar93 = vsubps_avx(auVar93,auVar20);
            fVar133 = auVar93._0_4_;
            fVar138 = auVar93._4_4_;
            fVar139 = auVar93._8_4_;
            fVar132 = auVar93._12_4_;
            fVar78 = auVar93._16_4_;
            fVar86 = auVar93._20_4_;
            fVar87 = auVar93._24_4_;
            in_ZMM6 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                         CONCAT424(0x3e2aaaaa,
                                                   CONCAT420(0x3e2aaaaa,
                                                             CONCAT416(0x3e2aaaaa,
                                                                       CONCAT412(0x3e2aaaaa,
                                                                                 CONCAT48(0x3e2aaaaa
                                                                                          ,
                                                  0x3e2aaaaa3e2aaaaa)))))));
            auVar121._0_4_ =
                 (fVar123 + 1.0 +
                 fVar123 * fVar123 *
                 (((((fVar123 * 0.00019875691 + 0.0013981999) * fVar123 + 0.008333452) * fVar123 +
                   0.041665796) * fVar123 + 0.16666666) * fVar123 + 0.5)) * auVar101._0_4_ + 1.0;
            auVar121._4_4_ =
                 (fVar129 + 1.0 +
                 fVar129 * fVar129 *
                 (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) * fVar129 +
                   0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5)) * auVar101._4_4_ + 1.0;
            auVar121._8_4_ =
                 (fVar130 + 1.0 +
                 fVar130 * fVar130 *
                 (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                   0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5)) * auVar101._8_4_ + 1.0;
            auVar121._12_4_ =
                 (fVar131 + 1.0 +
                 fVar131 * fVar131 *
                 (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                   0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar101._12_4_ + 1.0;
            auVar121._16_4_ =
                 (fVar150 + 1.0 +
                 fVar150 * fVar150 *
                 (((((fVar150 * 0.00019875691 + 0.0013981999) * fVar150 + 0.008333452) * fVar150 +
                   0.041665796) * fVar150 + 0.16666666) * fVar150 + 0.5)) * auVar92._0_4_ + 1.0;
            auVar121._20_4_ =
                 (fVar8 + 1.0 +
                 fVar8 * fVar8 *
                 (((((fVar8 * 0.00019875691 + 0.0013981999) * fVar8 + 0.008333452) * fVar8 +
                   0.041665796) * fVar8 + 0.16666666) * fVar8 + 0.5)) * auVar92._4_4_ + 1.0;
            auVar121._24_4_ =
                 (fVar9 + 1.0 +
                 fVar9 * fVar9 *
                 (((((fVar9 * 0.00019875691 + 0.0013981999) * fVar9 + 0.008333452) * fVar9 +
                   0.041665796) * fVar9 + 0.16666666) * fVar9 + 0.5)) * auVar92._8_4_ + 1.0;
            auVar121._28_4_ = auVar80._28_4_ + 1.0 + auVar125._28_4_ + 1.0;
            auVar102._0_4_ = (int)auVar79._0_4_;
            auVar102._4_4_ = (int)auVar79._4_4_;
            auVar102._8_4_ = (int)auVar79._8_4_;
            auVar102._12_4_ = (int)auVar79._12_4_;
            auVar110._16_4_ = (int)auVar79._16_4_;
            auVar110._0_16_ = auVar102;
            auVar110._20_4_ = (int)auVar79._20_4_;
            auVar110._24_4_ = (int)auVar79._24_4_;
            auVar110._28_4_ = (int)auVar79._28_4_;
            auVar101 = vpslld_avx(auVar102,0x17);
            auVar92 = vpslld_avx(auVar110._16_16_,0x17);
            auVar92 = vpaddd_avx(auVar148,auVar92);
            auVar101 = vpaddd_avx(auVar148,auVar101);
            auVar98._0_4_ =
                 (fVar133 + 1.0 +
                 fVar133 * fVar133 *
                 (((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) * fVar133 +
                   0.041665796) * fVar133 + 0.16666666) * fVar133 + 0.5)) * auVar101._0_4_ + 1.0;
            auVar98._4_4_ =
                 (fVar138 + 1.0 +
                 fVar138 * fVar138 *
                 (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) * fVar138 +
                   0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5)) * auVar101._4_4_ + 1.0;
            auVar98._8_4_ =
                 (fVar139 + 1.0 +
                 fVar139 * fVar139 *
                 (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                   0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5)) * auVar101._8_4_ + 1.0;
            auVar98._12_4_ =
                 (fVar132 + 1.0 +
                 fVar132 * fVar132 *
                 (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                   0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5)) * auVar101._12_4_ + 1.0;
            auVar98._16_4_ =
                 (fVar78 + 1.0 +
                 fVar78 * fVar78 *
                 (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78 +
                   0.041665796) * fVar78 + 0.16666666) * fVar78 + 0.5)) * auVar92._0_4_ + 1.0;
            auVar98._20_4_ =
                 (fVar86 + 1.0 +
                 fVar86 * fVar86 *
                 (((((fVar86 * 0.00019875691 + 0.0013981999) * fVar86 + 0.008333452) * fVar86 +
                   0.041665796) * fVar86 + 0.16666666) * fVar86 + 0.5)) * auVar92._4_4_ + 1.0;
            auVar98._24_4_ =
                 (fVar87 + 1.0 +
                 fVar87 * fVar87 *
                 (((((fVar87 * 0.00019875691 + 0.0013981999) * fVar87 + 0.008333452) * fVar87 +
                   0.041665796) * fVar87 + 0.16666666) * fVar87 + 0.5)) * auVar92._8_4_ + 1.0;
            auVar98._28_4_ = auVar93._28_4_ + 1.0 + auVar103._28_4_ + 1.0;
            auVar79 = vrcpps_avx(auVar98);
            fVar123 = auVar79._0_4_;
            fVar133 = auVar79._4_4_;
            fVar129 = auVar79._8_4_;
            fVar138 = auVar79._12_4_;
            fVar130 = auVar79._16_4_;
            fVar139 = auVar79._20_4_;
            fVar131 = auVar79._24_4_;
            auVar21._4_4_ = auVar98._4_4_ * (fVar133 + fVar133);
            auVar21._0_4_ = auVar98._0_4_ * (fVar123 + fVar123);
            auVar21._8_4_ = auVar98._8_4_ * (fVar129 + fVar129);
            auVar21._12_4_ = auVar98._12_4_ * (fVar138 + fVar138);
            auVar21._16_4_ = auVar98._16_4_ * (fVar130 + fVar130);
            auVar21._20_4_ = auVar98._20_4_ * (fVar139 + fVar139);
            auVar21._24_4_ = auVar98._24_4_ * (fVar131 + fVar131);
            auVar21._28_4_ = auVar98._28_4_;
            auVar136._8_4_ = 0x40000000;
            auVar136._0_8_ = 0x4000000040000000;
            auVar136._12_4_ = 0x40000000;
            auVar136._16_4_ = 0x40000000;
            auVar136._20_4_ = 0x40000000;
            auVar136._24_4_ = 0x40000000;
            auVar136._28_4_ = 0x40000000;
            auVar103 = vsubps_avx(auVar136,auVar21);
            auVar93 = vrcpps_avx(auVar121);
            in_ZMM5 = ZEXT3264(CONCAT428(0xbf800000,
                                         CONCAT424(0xbf800000,
                                                   CONCAT420(0xbf800000,
                                                             CONCAT416(0xbf800000,
                                                                       CONCAT412(0xbf800000,
                                                                                 CONCAT48(0xbf800000
                                                                                          ,
                                                  0xbf800000bf800000)))))));
            fVar132 = auVar79._28_4_ + auVar79._28_4_ + -1.0;
            auVar99._0_4_ = fVar123 + fVar123 + -1.0 + fVar123 * auVar103._0_4_;
            auVar99._4_4_ = fVar133 + fVar133 + -1.0 + fVar133 * auVar103._4_4_;
            auVar99._8_4_ = fVar129 + fVar129 + -1.0 + fVar129 * auVar103._8_4_;
            auVar99._12_4_ = fVar138 + fVar138 + -1.0 + fVar138 * auVar103._12_4_;
            auVar99._16_4_ = fVar130 + fVar130 + -1.0 + fVar130 * auVar103._16_4_;
            auVar99._20_4_ = fVar139 + fVar139 + -1.0 + fVar139 * auVar103._20_4_;
            auVar99._24_4_ = fVar131 + fVar131 + -1.0 + fVar131 * auVar103._24_4_;
            auVar99._28_4_ = fVar132 + auVar103._28_4_;
            fVar123 = auVar99._0_4_ * auVar93._0_4_;
            fVar133 = auVar99._4_4_ * auVar93._4_4_;
            fVar129 = auVar99._8_4_ * auVar93._8_4_;
            fVar138 = auVar99._12_4_ * auVar93._12_4_;
            fVar130 = auVar99._16_4_ * auVar93._16_4_;
            fVar139 = auVar99._20_4_ * auVar93._20_4_;
            fVar131 = auVar99._24_4_ * auVar93._24_4_;
            auVar22._4_4_ = auVar121._4_4_ * fVar133;
            auVar22._0_4_ = auVar121._0_4_ * fVar123;
            auVar22._8_4_ = auVar121._8_4_ * fVar129;
            auVar22._12_4_ = auVar121._12_4_ * fVar138;
            auVar22._16_4_ = auVar121._16_4_ * fVar130;
            auVar22._20_4_ = auVar121._20_4_ * fVar139;
            auVar22._24_4_ = auVar121._24_4_ * fVar131;
            auVar22._28_4_ = auVar121._28_4_;
            in_ZMM3 = ZEXT3264(auVar22);
            auVar79 = vsubps_avx(auVar99,auVar22);
            fVar123 = fVar123 + auVar93._0_4_ * auVar79._0_4_;
            fVar133 = fVar133 + auVar93._4_4_ * auVar79._4_4_;
            fVar129 = fVar129 + auVar93._8_4_ * auVar79._8_4_;
            fVar138 = fVar138 + auVar93._12_4_ * auVar79._12_4_;
            fVar130 = fVar130 + auVar93._16_4_ * auVar79._16_4_;
            fVar139 = fVar139 + auVar93._20_4_ * auVar79._20_4_;
            fVar131 = fVar131 + auVar93._24_4_ * auVar79._24_4_;
            fVar132 = fVar132 + auVar79._28_4_;
            *(undefined1 (*) [32])((long)pvVar46 + lVar32) = auVar84;
            pfVar3 = (float *)((long)local_2e0 + lVar32);
            *pfVar3 = fVar123;
            pfVar3[1] = fVar133;
            pfVar3[2] = fVar129;
            pfVar3[3] = fVar138;
            pfVar3[4] = fVar130;
            pfVar3[5] = fVar139;
            pfVar3[6] = fVar131;
            pfVar3[7] = fVar132;
            pfVar3 = (float *)((long)pvVar71 + lVar32);
            *pfVar3 = fVar123;
            pfVar3[1] = fVar133;
            pfVar3[2] = fVar129;
            pfVar3[3] = fVar138;
            pfVar3[4] = fVar130;
            pfVar3[5] = fVar139;
            pfVar3[6] = fVar131;
            pfVar3[7] = fVar132;
            uVar35 = uVar35 - 1;
            lVar29 = lVar32 + 0x20;
          } while (1 < uVar35);
          lVar54 = lVar54 + lVar29;
          pvVar52 = (void *)((long)pvVar52 + lVar29);
          ppp_Var44 = (_func_int ***)((long)(ppp_Var44 + 4) + lVar32);
          pAVar60 = (Allocator *)
                    ((long)&((Allocator *)((long)local_78.data + 0x20))->_vptr_Allocator + lVar32);
          local_2e0 = (void *)((long)local_2e0 + lVar29);
          pvVar46 = (void *)((long)pvVar46 + lVar29);
          pvVar71 = (void *)((long)pvVar71 + lVar29);
        }
        if (uVar57 != 0) {
          lVar29 = 0;
          iVar34 = iVar26;
          do {
            fVar123 = *(float *)(lVar54 + lVar29);
            in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
            in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
            in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
            fVar133 = expf(-*(float *)((long)&pAVar60->_vptr_Allocator + lVar29));
            fVar129 = expf(-*(float *)((long)ppp_Var44 + lVar29));
            fVar138 = expf(-*(float *)((long)pvVar52 + lVar29));
            fVar123 = tanhf(fVar123);
            fVar123 = *(float *)((long)pvVar46 + lVar29) / (fVar129 + 1.0) +
                      fVar123 / (fVar133 + 1.0);
            fVar133 = tanhf(fVar123);
            fVar133 = fVar133 / (fVar138 + 1.0);
            *(float *)((long)pvVar46 + lVar29) = fVar123;
            *(float *)((long)local_2e0 + lVar29) = fVar133;
            *(float *)((long)pvVar71 + lVar29) = fVar133;
            iVar34 = iVar34 + -1;
            lVar29 = lVar29 + 4;
          } while (1 < iVar34);
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar6);
    }
    iVar26 = 0;
  }
  piVar24 = (int *)CONCAT44(local_78.refcount._4_4_,(int)local_78.refcount);
  if (piVar24 != (int *)0x0) {
    LOCK();
    *piVar24 = *piVar24 + -1;
    UNLOCK();
    if (*piVar24 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_78.data != (Allocator *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar26;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // 4 x num_output
    Mat gates(num_output, 4, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;
        int remain_output = (num_output >> 1) << 1;
        for (int q = 0; q + 1 < num_output; q += 2)
        {
            const float* x = bottom_blob.row(ti);
            const float* hidden_ptr_r = hidden_state;
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data_I = gates.row(0);
            float* gates_data_F = gates.row(1);
            float* gates_data_O = gates.row(2);
            float* gates_data_G = gates.row(3);
            // gate I F O G
            const float* weight_xc_I_0 = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_F_0 = weight_xc.row(num_output * 1 + q);
            const float* weight_xc_O_0 = weight_xc.row(num_output * 2 + q);
            const float* weight_xc_G_0 = weight_xc.row(num_output * 3 + q);
            const float* weight_xc_I_1 = weight_xc.row(num_output * 0 + (q + 1));
            const float* weight_xc_F_1 = weight_xc.row(num_output * 1 + (q + 1));
            const float* weight_xc_O_1 = weight_xc.row(num_output * 2 + (q + 1));
            const float* weight_xc_G_1 = weight_xc.row(num_output * 3 + (q + 1));

            const float* weight_hc_I_0 = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_F_0 = weight_hc.row(num_output * 1 + q);
            const float* weight_hc_O_0 = weight_hc.row(num_output * 2 + q);
            const float* weight_hc_G_0 = weight_hc.row(num_output * 3 + q);
            const float* weight_hc_I_1 = weight_hc.row(num_output * 0 + (q + 1));
            const float* weight_hc_F_1 = weight_hc.row(num_output * 1 + (q + 1));
            const float* weight_hc_O_1 = weight_hc.row(num_output * 2 + (q + 1));
            const float* weight_hc_G_1 = weight_hc.row(num_output * 3 + (q + 1));

            // float I = bias_c_I[q];
            // float F = bias_c_F[q];
            // float O = bias_c_O[q];
            // float G = bias_c_G[q];
            __m256 _sumI_0 = _mm256_setzero_ps();
            __m256 _sumF_0 = _mm256_setzero_ps();
            __m256 _sumO_0 = _mm256_setzero_ps();
            __m256 _sumG_0 = _mm256_setzero_ps();
            __m256 _sumI_1 = _mm256_setzero_ps();
            __m256 _sumF_1 = _mm256_setzero_ps();
            __m256 _sumO_1 = _mm256_setzero_ps();
            __m256 _sumG_1 = _mm256_setzero_ps();
            int nn_num_size = size >> 3;
            int remain_size = size & 7;
            for (; nn_num_size > 0; nn_num_size--)
            {
                __m256 xi = _mm256_loadu_ps(x);
                _sumI_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_I_0), xi, _sumI_0);
                _sumF_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_F_0), xi, _sumF_0);
                _sumO_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_O_0), xi, _sumO_0);
                _sumG_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_G_0), xi, _sumG_0);
                _sumI_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_I_1), xi, _sumI_1);
                _sumF_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_F_1), xi, _sumF_1);
                _sumO_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_O_1), xi, _sumO_1);
                _sumG_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_G_1), xi, _sumG_1);
                x += 8;
                weight_xc_I_0 += 8;
                weight_xc_F_0 += 8;
                weight_xc_O_0 += 8;
                weight_xc_G_0 += 8;
                weight_xc_I_1 += 8;
                weight_xc_F_1 += 8;
                weight_xc_O_1 += 8;
                weight_xc_G_1 += 8;
            }
            int nn_num_output = num_output >> 3;
            int remain_num_output = num_output & 7;
            for (; nn_num_output > 0; nn_num_output--)
            {
                __m256 h_cont = _mm256_loadu_ps(hidden_ptr_r);

                _sumI_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_I_0), h_cont, _sumI_0);
                _sumF_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_F_0), h_cont, _sumF_0);
                _sumO_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_O_0), h_cont, _sumO_0);
                _sumG_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_G_0), h_cont, _sumG_0);
                _sumI_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_I_1), h_cont, _sumI_1);
                _sumF_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_F_1), h_cont, _sumF_1);
                _sumO_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_O_1), h_cont, _sumO_1);
                _sumG_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_G_1), h_cont, _sumG_1);
                hidden_ptr_r += 8;
                weight_hc_I_0 += 8;
                weight_hc_F_0 += 8;
                weight_hc_O_0 += 8;
                weight_hc_G_0 += 8;
                weight_hc_I_1 += 8;
                weight_hc_F_1 += 8;
                weight_hc_O_1 += 8;
                weight_hc_G_1 += 8;
            }
            float sums[8];
            _mm256_storeu_ps(sums, HorizontalSums(_sumI_0, _sumF_0, _sumO_0, _sumG_0, _sumI_1, _sumF_1, _sumO_1, _sumG_1));
            sums[0] += bias_c_I[q];
            sums[1] += bias_c_F[q];
            sums[2] += bias_c_O[q];
            sums[3] += bias_c_G[q];
            sums[4] += bias_c_I[q + 1];
            sums[5] += bias_c_F[q + 1];
            sums[6] += bias_c_O[q + 1];
            sums[7] += bias_c_G[q + 1];

            for (; remain_size > 0; remain_size--)
            {
                float xi = *x;
                sums[0] += *weight_xc_I_0 * xi;
                sums[1] += *weight_xc_F_0 * xi;
                sums[2] += *weight_xc_O_0 * xi;
                sums[3] += *weight_xc_G_0 * xi;
                sums[4] += *weight_xc_I_1 * xi;
                sums[5] += *weight_xc_F_1 * xi;
                sums[6] += *weight_xc_O_1 * xi;
                sums[7] += *weight_xc_G_1 * xi;
                x++;
                weight_xc_I_0++;
                weight_xc_F_0++;
                weight_xc_O_0++;
                weight_xc_G_0++;
                weight_xc_I_1++;
                weight_xc_F_1++;
                weight_xc_O_1++;
                weight_xc_G_1++;
            }

            for (; remain_num_output > 0; remain_num_output--)
            {
                float h_cont = *hidden_ptr_r;
                sums[0] += *weight_hc_I_0 * h_cont;
                sums[1] += *weight_hc_F_0 * h_cont;
                sums[2] += *weight_hc_O_0 * h_cont;
                sums[3] += *weight_hc_G_0 * h_cont;
                sums[4] += *weight_hc_I_1 * h_cont;
                sums[5] += *weight_hc_F_1 * h_cont;
                sums[6] += *weight_hc_O_1 * h_cont;
                sums[7] += *weight_hc_G_1 * h_cont;
                hidden_ptr_r++;
                weight_hc_I_0++;
                weight_hc_F_0++;
                weight_hc_O_0++;
                weight_hc_G_0++;
                weight_hc_I_1++;
                weight_hc_F_1++;
                weight_hc_O_1++;
                weight_hc_G_1++;
            }
            gates_data_I[q] = sums[0];
            gates_data_F[q] = sums[1];
            gates_data_O[q] = sums[2];
            gates_data_G[q] = sums[3];
            gates_data_I[q + 1] = sums[4];
            gates_data_F[q + 1] = sums[5];
            gates_data_O[q + 1] = sums[6];
            gates_data_G[q + 1] = sums[7];
        }

        for (int q = remain_output; q < num_output; q++)
        {
            const float* x = bottom_blob.row(ti);
            const float* hidden_ptr_r = hidden_state;
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data_I = gates.row(0);
            float* gates_data_F = gates.row(1);
            float* gates_data_O = gates.row(2);
            float* gates_data_G = gates.row(3);
            // gate I F O G
            const float* weight_xc_I = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_F = weight_xc.row(num_output * 1 + q);
            const float* weight_xc_O = weight_xc.row(num_output * 2 + q);
            const float* weight_xc_G = weight_xc.row(num_output * 3 + q);

            const float* weight_hc_I = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_F = weight_hc.row(num_output * 1 + q);
            const float* weight_hc_O = weight_hc.row(num_output * 2 + q);
            const float* weight_hc_G = weight_hc.row(num_output * 3 + q);

            // float I = bias_c_I[q];
            // float F = bias_c_F[q];
            // float O = bias_c_O[q];
            // float G = bias_c_G[q];
            __m256 _sumI = _mm256_setzero_ps();
            __m256 _sumF = _mm256_setzero_ps();
            __m256 _sumO = _mm256_setzero_ps();
            __m256 _sumG = _mm256_setzero_ps();
            int nn_num_size = size >> 3;
            int remain_size = size & 7;
            for (; nn_num_size > 0; nn_num_size--)
            {
                __m256 xi = _mm256_loadu_ps(x);
                _sumI = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_I), xi, _sumI);
                _sumF = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_F), xi, _sumF);
                _sumO = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_O), xi, _sumO);
                _sumG = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_G), xi, _sumG);
                x += 8;
                weight_xc_I += 8;
                weight_xc_F += 8;
                weight_xc_O += 8;
                weight_xc_G += 8;
            }
            int nn_num_output = num_output >> 3;
            int remain_num_output = num_output & 7;
            for (; nn_num_output > 0; nn_num_output--)
            {
                __m256 h_cont = _mm256_loadu_ps(hidden_ptr_r);

                _sumI = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_I), h_cont, _sumI);
                _sumF = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_F), h_cont, _sumF);
                _sumO = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_O), h_cont, _sumO);
                _sumG = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_G), h_cont, _sumG);
                hidden_ptr_r += 8;
                weight_hc_I += 8;
                weight_hc_F += 8;
                weight_hc_O += 8;
                weight_hc_G += 8;
            }
            float sums[4];
            _mm_storeu_ps(sums, HorizontalSums(_sumI, _sumF, _sumO, _sumG));
            sums[0] += bias_c_I[q];
            sums[1] += bias_c_F[q];
            sums[2] += bias_c_O[q];
            sums[3] += bias_c_G[q];

            for (; remain_size > 0; remain_size--)
            {
                float xi = *x;
                sums[0] += *weight_xc_I * xi;
                sums[1] += *weight_xc_F * xi;
                sums[2] += *weight_xc_O * xi;
                sums[3] += *weight_xc_G * xi;
                x++;
                weight_xc_I++;
                weight_xc_F++;
                weight_xc_O++;
                weight_xc_G++;
            }

            for (; remain_num_output > 0; remain_num_output--)
            {
                float h_cont = *hidden_ptr_r;
                sums[0] += *weight_hc_I * h_cont;
                sums[1] += *weight_hc_F * h_cont;
                sums[2] += *weight_hc_O * h_cont;
                sums[3] += *weight_hc_G * h_cont;
                hidden_ptr_r++;
                weight_hc_I++;
                weight_hc_F++;
                weight_hc_O++;
                weight_hc_G++;
            }
            gates_data_I[q] = sums[0];
            gates_data_F[q] = sums[1];
            gates_data_O[q] = sums[2];
            gates_data_G[q] = sums[3];
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        float* cell_ptr = cell_state;
        float* hidden_ptr = hidden_state;
        const float* gates_data_I = gates.row(0);
        const float* gates_data_F = gates.row(1);
        const float* gates_data_O = gates.row(2);
        const float* gates_data_G = gates.row(3);
        int nn_activation = num_output >> 3;
        int remain_activations = num_output & 7;
        for (; nn_activation > 0; nn_activation--)
        {
            __m256 I = sigmoid_avx(_mm256_loadu_ps(gates_data_I));
            __m256 F = sigmoid_avx(_mm256_loadu_ps(gates_data_F));
            __m256 O = sigmoid_avx(_mm256_loadu_ps(gates_data_O));
            __m256 G = tanh_avx(_mm256_loadu_ps(gates_data_G));
            __m256 cell2 = _mm256_add_ps(_mm256_mul_ps(F, _mm256_loadu_ps(cell_ptr)), _mm256_mul_ps(I, G));
            __m256 H = _mm256_mul_ps(O, tanh_avx(cell2));
            _mm256_storeu_ps(cell_ptr, cell2);
            _mm256_storeu_ps(hidden_ptr, H);
            _mm256_storeu_ps(output_data, H);
            cell_ptr += 8;
            output_data += 8;
            hidden_ptr += 8;
            gates_data_I += 8;
            gates_data_F += 8;
            gates_data_O += 8;
            gates_data_G += 8;
        }
        for (; remain_activations > 0; remain_activations--)
        {
            float I = *gates_data_I;
            float F = *gates_data_F;
            float O = *gates_data_O;
            float G = *gates_data_G;

            I = 1.f / (1.f + exp(-I));
            F = 1.f / (1.f + exp(-F));
            O = 1.f / (1.f + exp(-O));
            G = tanh(G);
            float cell2 = F * *cell_ptr + I * G;
            float H = O * tanh(cell2);
            *cell_ptr = cell2;
            *hidden_ptr = H;
            *output_data = H;
            cell_ptr++;
            output_data++;
            hidden_ptr++;
            gates_data_I++;
            gates_data_F++;
            gates_data_O++;
            gates_data_G++;
        }

        // no cell output here
    }

    return 0;
}